

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [28];
  undefined4 uVar72;
  ulong uVar73;
  Geometry *pGVar74;
  RTCIntersectArguments *pRVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  long lVar80;
  long lVar81;
  undefined8 uVar82;
  float fVar97;
  vint4 bi_2;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar96;
  float fVar98;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar87 [16];
  undefined1 auVar95 [32];
  undefined8 uVar102;
  vint4 bi_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar106 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  undefined1 auVar116 [64];
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [32];
  undefined1 auVar123 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  float fVar132;
  float fVar140;
  vint4 ai_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar173 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined4 uVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [64];
  float fVar196;
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar197 [64];
  float fVar204;
  float fVar205;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar206;
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 (*local_5d8) [16];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  undefined8 uStack_578;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [8];
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  long local_4f0;
  ulong local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  int local_1c0;
  int local_1bc;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_140 [4];
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar178 [16];
  
  PVar8 = prim[1];
  uVar73 = (ulong)(byte)PVar8;
  fVar119 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar146 = vsubps_avx(auVar146,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar83._0_4_ = fVar119 * auVar146._0_4_;
  auVar83._4_4_ = fVar119 * auVar146._4_4_;
  auVar83._8_4_ = fVar119 * auVar146._8_4_;
  auVar83._12_4_ = fVar119 * auVar146._12_4_;
  auVar152._0_4_ = fVar119 * auVar12._0_4_;
  auVar152._4_4_ = fVar119 * auVar12._4_4_;
  auVar152._8_4_ = fVar119 * auVar12._8_4_;
  auVar152._12_4_ = fVar119 * auVar12._12_4_;
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x12 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x13 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar190 = ZEXT1664(auVar85);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x14 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar198._4_4_ = auVar152._0_4_;
  auVar198._0_4_ = auVar152._0_4_;
  auVar198._8_4_ = auVar152._0_4_;
  auVar198._12_4_ = auVar152._0_4_;
  auVar104 = vshufps_avx(auVar152,auVar152,0x55);
  auVar84 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar119 = auVar84._0_4_;
  auVar185._0_4_ = fVar119 * auVar14._0_4_;
  fVar118 = auVar84._4_4_;
  auVar185._4_4_ = fVar118 * auVar14._4_4_;
  fVar96 = auVar84._8_4_;
  auVar185._8_4_ = fVar96 * auVar14._8_4_;
  fVar97 = auVar84._12_4_;
  auVar185._12_4_ = fVar97 * auVar14._12_4_;
  auVar177._0_4_ = auVar17._0_4_ * fVar119;
  auVar177._4_4_ = auVar17._4_4_ * fVar118;
  auVar177._8_4_ = auVar17._8_4_ * fVar96;
  auVar177._12_4_ = auVar17._12_4_ * fVar97;
  auVar169._0_4_ = auVar120._0_4_ * fVar119;
  auVar169._4_4_ = auVar120._4_4_ * fVar118;
  auVar169._8_4_ = auVar120._8_4_ * fVar96;
  auVar169._12_4_ = auVar120._12_4_ * fVar97;
  auVar84 = vfmadd231ps_fma(auVar185,auVar104,auVar12);
  auVar105 = vfmadd231ps_fma(auVar177,auVar104,auVar16);
  auVar104 = vfmadd231ps_fma(auVar169,auVar85,auVar104);
  auVar133 = vfmadd231ps_fma(auVar84,auVar198,auVar146);
  auVar105 = vfmadd231ps_fma(auVar105,auVar198,auVar15);
  auVar142 = vfmadd231ps_fma(auVar104,auVar86,auVar198);
  auVar199._4_4_ = auVar83._0_4_;
  auVar199._0_4_ = auVar83._0_4_;
  auVar199._8_4_ = auVar83._0_4_;
  auVar199._12_4_ = auVar83._0_4_;
  auVar104 = vshufps_avx(auVar83,auVar83,0x55);
  auVar84 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar119 = auVar84._0_4_;
  auVar153._0_4_ = fVar119 * auVar14._0_4_;
  fVar118 = auVar84._4_4_;
  auVar153._4_4_ = fVar118 * auVar14._4_4_;
  fVar96 = auVar84._8_4_;
  auVar153._8_4_ = fVar96 * auVar14._8_4_;
  fVar97 = auVar84._12_4_;
  auVar153._12_4_ = fVar97 * auVar14._12_4_;
  auVar103._0_4_ = auVar17._0_4_ * fVar119;
  auVar103._4_4_ = auVar17._4_4_ * fVar118;
  auVar103._8_4_ = auVar17._8_4_ * fVar96;
  auVar103._12_4_ = auVar17._12_4_ * fVar97;
  auVar84._0_4_ = auVar120._0_4_ * fVar119;
  auVar84._4_4_ = auVar120._4_4_ * fVar118;
  auVar84._8_4_ = auVar120._8_4_ * fVar96;
  auVar84._12_4_ = auVar120._12_4_ * fVar97;
  auVar12 = vfmadd231ps_fma(auVar153,auVar104,auVar12);
  auVar14 = vfmadd231ps_fma(auVar103,auVar104,auVar16);
  auVar16 = vfmadd231ps_fma(auVar84,auVar104,auVar85);
  auVar17 = vfmadd231ps_fma(auVar12,auVar199,auVar146);
  auVar85 = vfmadd231ps_fma(auVar14,auVar199,auVar15);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar120 = vfmadd231ps_fma(auVar16,auVar199,auVar86);
  auVar146 = vandps_avx(auVar133,local_290);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar146 = vcmpps_avx(auVar146,auVar141,1);
  auVar12 = vblendvps_avx(auVar133,auVar141,auVar146);
  auVar146 = vandps_avx(auVar105,local_290);
  auVar146 = vcmpps_avx(auVar146,auVar141,1);
  auVar14 = vblendvps_avx(auVar105,auVar141,auVar146);
  auVar146 = vandps_avx(local_290,auVar142);
  auVar146 = vcmpps_avx(auVar146,auVar141,1);
  auVar146 = vblendvps_avx(auVar142,auVar141,auVar146);
  auVar15 = vrcpps_avx(auVar12);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar15,auVar170);
  auVar15 = vfmadd132ps_fma(auVar12,auVar15,auVar15);
  auVar12 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar12,auVar170);
  auVar16 = vfmadd132ps_fma(auVar14,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar146);
  auVar146 = vfnmadd213ps_fma(auVar146,auVar12,auVar170);
  auVar86 = vfmadd132ps_fma(auVar146,auVar12,auVar12);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar146 = vpmovsxwd_avx(auVar146);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar14 = vsubps_avx(auVar146,auVar17);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar146 = vpmovsxwd_avx(auVar12);
  auVar142._0_4_ = auVar15._0_4_ * auVar14._0_4_;
  auVar142._4_4_ = auVar15._4_4_ * auVar14._4_4_;
  auVar142._8_4_ = auVar15._8_4_ * auVar14._8_4_;
  auVar142._12_4_ = auVar15._12_4_ * auVar14._12_4_;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar17);
  auVar154._0_4_ = auVar15._0_4_ * auVar146._0_4_;
  auVar154._4_4_ = auVar15._4_4_ * auVar146._4_4_;
  auVar154._8_4_ = auVar15._8_4_ * auVar146._8_4_;
  auVar154._12_4_ = auVar15._12_4_ * auVar146._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar73 * 0xe + 6);
  auVar146 = vpmovsxwd_avx(auVar14);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar12 = vsubps_avx(auVar146,auVar85);
  auVar105._1_3_ = 0;
  auVar105[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar146 = vpmovsxwd_avx(auVar15);
  auVar160._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar160._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar160._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar160._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar85);
  auVar104._0_4_ = auVar16._0_4_ * auVar146._0_4_;
  auVar104._4_4_ = auVar16._4_4_ * auVar146._4_4_;
  auVar104._8_4_ = auVar16._8_4_ * auVar146._8_4_;
  auVar104._12_4_ = auVar16._12_4_ * auVar146._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar73 * 0x15 + 6);
  auVar146 = vpmovsxwd_avx(auVar16);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar120);
  auVar133._0_4_ = auVar86._0_4_ * auVar146._0_4_;
  auVar133._4_4_ = auVar86._4_4_ * auVar146._4_4_;
  auVar133._8_4_ = auVar86._8_4_ * auVar146._8_4_;
  auVar133._12_4_ = auVar86._12_4_ * auVar146._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar146 = vpmovsxwd_avx(auVar17);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar146 = vsubps_avx(auVar146,auVar120);
  auVar85._0_4_ = auVar86._0_4_ * auVar146._0_4_;
  auVar85._4_4_ = auVar86._4_4_ * auVar146._4_4_;
  auVar85._8_4_ = auVar86._8_4_ * auVar146._8_4_;
  auVar85._12_4_ = auVar86._12_4_ * auVar146._12_4_;
  auVar146 = vpminsd_avx(auVar142,auVar154);
  auVar12 = vpminsd_avx(auVar160,auVar104);
  auVar146 = vmaxps_avx(auVar146,auVar12);
  auVar12 = vpminsd_avx(auVar133,auVar85);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar178._4_4_ = uVar72;
  auVar178._0_4_ = uVar72;
  auVar178._8_4_ = uVar72;
  auVar178._12_4_ = uVar72;
  auVar184 = ZEXT1664(auVar178);
  auVar12 = vmaxps_avx(auVar12,auVar178);
  auVar146 = vmaxps_avx(auVar146,auVar12);
  local_2a0._0_4_ = auVar146._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar146._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar146._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar146._12_4_ * 0.99999964;
  auVar146 = vpmaxsd_avx(auVar142,auVar154);
  auVar12 = vpmaxsd_avx(auVar160,auVar104);
  auVar146 = vminps_avx(auVar146,auVar12);
  auVar12 = vpmaxsd_avx(auVar133,auVar85);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar72;
  auVar120._0_4_ = uVar72;
  auVar120._8_4_ = uVar72;
  auVar120._12_4_ = uVar72;
  auVar12 = vminps_avx(auVar12,auVar120);
  auVar146 = vminps_avx(auVar146,auVar12);
  auVar86._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar86._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar86._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar86._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar105[4] = PVar8;
  auVar105._5_3_ = 0;
  auVar105[8] = PVar8;
  auVar105._9_3_ = 0;
  auVar105[0xc] = PVar8;
  auVar105._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar105,_DAT_01f4ad30);
  auVar146 = vcmpps_avx(local_2a0,auVar86,2);
  auVar146 = vandps_avx(auVar146,auVar12);
  uVar77 = vmovmskps_avx(auVar146);
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  local_5d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  for (; local_4e8 = (ulong)uVar77, local_4e8 != 0; uVar77 = (uint)uVar79 & uVar77) {
    local_720 = auVar184._0_32_;
    local_6c0 = auVar190._0_32_;
    lVar81 = 0;
    for (uVar76 = local_4e8; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      lVar81 = lVar81 + 1;
    }
    uVar79 = local_4e8 - 1 & local_4e8;
    uVar77 = *(uint *)(prim + lVar81 * 4 + 6);
    uVar76 = (ulong)(uint)((int)lVar81 << 6);
    uVar9 = *(uint *)(prim + 2);
    local_728 = (ulong)uVar9;
    local_4c0 = (context->scene->geometries).items[local_728].ptr;
    pPVar1 = prim + uVar76 + uVar73 * 0x19 + 0x16;
    local_630 = *(undefined8 *)pPVar1;
    uStack_628 = *(undefined8 *)(pPVar1 + 8);
    if (uVar79 != 0) {
      uVar78 = uVar79 - 1 & uVar79;
      for (uVar21 = uVar79; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
      }
      if (uVar78 != 0) {
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_5f0 = *(undefined1 (*) [16])(prim + uVar76 + uVar73 * 0x19 + 0x26);
    local_600 = *(undefined1 (*) [16])(prim + uVar76 + uVar73 * 0x19 + 0x36);
    _local_500 = *(undefined1 (*) [16])(prim + uVar76 + uVar73 * 0x19 + 0x46);
    auVar146 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    iVar10 = (int)local_4c0[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar15 = vinsertps_avx(auVar146,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar12 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar15);
    uVar72 = auVar12._0_4_;
    auVar143._4_4_ = uVar72;
    auVar143._0_4_ = uVar72;
    auVar143._8_4_ = uVar72;
    auVar143._12_4_ = uVar72;
    auVar146 = vshufps_avx(auVar12,auVar12,0x55);
    auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    fVar119 = pre->ray_space[k].vz.field_0.m128[0];
    fVar118 = pre->ray_space[k].vz.field_0.m128[1];
    fVar96 = pre->ray_space[k].vz.field_0.m128[2];
    fVar97 = pre->ray_space[k].vz.field_0.m128[3];
    auVar161._0_4_ = fVar119 * auVar12._0_4_;
    auVar161._4_4_ = fVar118 * auVar12._4_4_;
    auVar161._8_4_ = fVar96 * auVar12._8_4_;
    auVar161._12_4_ = fVar97 * auVar12._12_4_;
    auVar146 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar7,auVar146);
    auVar17 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar6,auVar143);
    auVar146 = vblendps_avx(auVar17,*(undefined1 (*) [16])pPVar1,8);
    auVar14 = vsubps_avx(local_5f0,auVar15);
    uVar72 = auVar14._0_4_;
    auVar162._4_4_ = uVar72;
    auVar162._0_4_ = uVar72;
    auVar162._8_4_ = uVar72;
    auVar162._12_4_ = uVar72;
    auVar12 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar179._0_4_ = fVar119 * auVar14._0_4_;
    auVar179._4_4_ = fVar118 * auVar14._4_4_;
    auVar179._8_4_ = fVar96 * auVar14._8_4_;
    auVar179._12_4_ = fVar97 * auVar14._12_4_;
    auVar12 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar12);
    auVar86 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar6,auVar162);
    auVar12 = vblendps_avx(auVar86,local_5f0,8);
    auVar16 = vsubps_avx(local_600,auVar15);
    uVar72 = auVar16._0_4_;
    auVar171._4_4_ = uVar72;
    auVar171._0_4_ = uVar72;
    auVar171._8_4_ = uVar72;
    auVar171._12_4_ = uVar72;
    auVar14 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar189._0_4_ = fVar119 * auVar16._0_4_;
    auVar189._4_4_ = fVar118 * auVar16._4_4_;
    auVar189._8_4_ = fVar96 * auVar16._8_4_;
    auVar189._12_4_ = fVar97 * auVar16._12_4_;
    auVar14 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar7,auVar14);
    auVar85 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar6,auVar171);
    auVar14 = vblendps_avx(auVar85,local_600,8);
    auVar16 = vsubps_avx(_local_500,auVar15);
    uVar72 = auVar16._0_4_;
    auVar172._4_4_ = uVar72;
    auVar172._0_4_ = uVar72;
    auVar172._8_4_ = uVar72;
    auVar172._12_4_ = uVar72;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar191._0_4_ = fVar119 * auVar16._0_4_;
    auVar191._4_4_ = fVar118 * auVar16._4_4_;
    auVar191._8_4_ = fVar96 * auVar16._8_4_;
    auVar191._12_4_ = fVar97 * auVar16._12_4_;
    auVar15 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar7,auVar15);
    auVar120 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar172);
    auVar15 = vblendps_avx(auVar120,_local_500,8);
    auVar146 = vandps_avx(auVar146,local_290);
    auVar12 = vandps_avx(auVar12,local_290);
    auVar16 = vmaxps_avx(auVar146,auVar12);
    auVar146 = vandps_avx(auVar14,local_290);
    auVar12 = vandps_avx(auVar15,local_290);
    auVar146 = vmaxps_avx(auVar146,auVar12);
    auVar146 = vmaxps_avx(auVar16,auVar146);
    auVar12 = vmovshdup_avx(auVar146);
    auVar12 = vmaxss_avx(auVar12,auVar146);
    auVar146 = vshufpd_avx(auVar146,auVar146,1);
    auVar146 = vmaxss_avx(auVar146,auVar12);
    local_4f0 = (long)iVar10;
    lVar81 = local_4f0 * 0x44;
    auVar12 = vmovshdup_avx(auVar17);
    uVar82 = auVar12._0_8_;
    local_4a0._8_8_ = uVar82;
    local_4a0._0_8_ = uVar82;
    local_4a0._16_8_ = uVar82;
    local_4a0._24_8_ = uVar82;
    auVar14 = vmovshdup_avx(auVar86);
    uVar82 = auVar14._0_8_;
    local_680._8_8_ = uVar82;
    local_680._0_8_ = uVar82;
    local_680._16_8_ = uVar82;
    local_680._24_8_ = uVar82;
    auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x908);
    uVar188 = auVar85._0_4_;
    local_6e0._4_4_ = uVar188;
    local_6e0._0_4_ = uVar188;
    local_6e0._8_4_ = uVar188;
    local_6e0._12_4_ = uVar188;
    local_6e0._16_4_ = uVar188;
    local_6e0._20_4_ = uVar188;
    local_6e0._24_4_ = uVar188;
    local_6e0._28_4_ = uVar188;
    auVar14 = vmovshdup_avx(auVar85);
    uVar82 = auVar14._0_8_;
    local_620._8_8_ = uVar82;
    local_620._0_8_ = uVar82;
    local_620._16_8_ = uVar82;
    local_620._24_8_ = uVar82;
    fVar119 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar81 + 0xd8c);
    auVar71 = *(undefined1 (*) [28])(bspline_basis0 + lVar81 + 0xd8c);
    local_660 = auVar120._0_4_;
    auVar15 = vmovshdup_avx(auVar120);
    uVar82 = auVar15._0_8_;
    auVar149._4_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xd90);
    auVar149._0_4_ = local_660 * fVar119;
    auVar149._8_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xd94);
    auVar149._12_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xd98);
    auVar149._16_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xd9c);
    auVar149._20_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xda0);
    auVar149._24_4_ = local_660 * *(float *)(bspline_basis0 + lVar81 + 0xda4);
    auVar149._28_4_ = *(undefined4 *)(bspline_basis0 + lVar81 + 0xda8);
    auVar16 = vfmadd231ps_fma(auVar149,auVar138,local_6e0);
    fVar132 = auVar15._0_4_;
    auVar159._0_4_ = fVar132 * fVar119;
    fVar140 = auVar15._4_4_;
    auVar159._4_4_ = fVar140 * *(float *)(bspline_basis0 + lVar81 + 0xd90);
    auVar159._8_4_ = fVar132 * *(float *)(bspline_basis0 + lVar81 + 0xd94);
    auVar159._12_4_ = fVar140 * *(float *)(bspline_basis0 + lVar81 + 0xd98);
    auVar159._16_4_ = fVar132 * *(float *)(bspline_basis0 + lVar81 + 0xd9c);
    auVar159._20_4_ = fVar140 * *(float *)(bspline_basis0 + lVar81 + 0xda0);
    auVar159._24_4_ = fVar132 * *(float *)(bspline_basis0 + lVar81 + 0xda4);
    auVar159._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar159,auVar138,local_620);
    auVar149 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x484);
    uVar72 = auVar86._0_4_;
    local_700._4_4_ = uVar72;
    local_700._0_4_ = uVar72;
    local_700._8_4_ = uVar72;
    local_700._12_4_ = uVar72;
    local_700._16_4_ = uVar72;
    local_700._20_4_ = uVar72;
    local_700._24_4_ = uVar72;
    local_700._28_4_ = uVar72;
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar149,local_700);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar149,local_680);
    auVar159 = *(undefined1 (*) [32])(bspline_basis0 + lVar81);
    local_460._0_4_ = auVar17._0_4_;
    auVar200._4_4_ = local_460._0_4_;
    auVar200._0_4_ = local_460._0_4_;
    auVar200._8_4_ = local_460._0_4_;
    auVar200._12_4_ = local_460._0_4_;
    auVar200._16_4_ = local_460._0_4_;
    auVar200._20_4_ = local_460._0_4_;
    auVar200._24_4_ = local_460._0_4_;
    auVar200._28_4_ = local_460._0_4_;
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar159,auVar200);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar159,local_4a0);
    local_340 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x908);
    fVar118 = *(float *)(bspline_basis1 + lVar81 + 0xd8c);
    fVar96 = *(float *)(bspline_basis1 + lVar81 + 0xd90);
    fVar97 = *(float *)(bspline_basis1 + lVar81 + 0xd94);
    fVar98 = *(float *)(bspline_basis1 + lVar81 + 0xd98);
    fVar99 = *(float *)(bspline_basis1 + lVar81 + 0xd9c);
    fVar100 = *(float *)(bspline_basis1 + lVar81 + 0xda0);
    fVar101 = *(float *)(bspline_basis1 + lVar81 + 0xda4);
    auVar94._4_4_ = local_660 * fVar96;
    auVar94._0_4_ = local_660 * fVar118;
    auVar94._8_4_ = local_660 * fVar97;
    auVar94._12_4_ = local_660 * fVar98;
    auVar94._16_4_ = local_660 * fVar99;
    auVar94._20_4_ = local_660 * fVar100;
    auVar94._24_4_ = local_660 * fVar101;
    auVar94._28_4_ = *(undefined4 *)(bspline_basis0 + lVar81 + 0xda8);
    auVar104 = vfmadd231ps_fma(auVar94,local_340,local_6e0);
    auVar112._4_4_ = fVar140 * fVar96;
    auVar112._0_4_ = fVar132 * fVar118;
    auVar112._8_4_ = fVar132 * fVar97;
    auVar112._12_4_ = fVar140 * fVar98;
    auVar112._16_4_ = fVar132 * fVar99;
    auVar112._20_4_ = fVar140 * fVar100;
    auVar112._24_4_ = fVar132 * fVar101;
    auVar112._28_4_ = uVar188;
    auVar84 = vfmadd231ps_fma(auVar112,local_340,local_620);
    auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x484);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar94,local_700);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar94,local_680);
    auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar81);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar112,auVar200);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar112,local_4a0);
    local_2e0 = ZEXT1632(auVar104);
    local_2c0 = ZEXT1632(auVar16);
    auVar18 = vsubps_avx(local_2e0,local_2c0);
    local_300 = ZEXT1632(auVar84);
    _local_320 = ZEXT1632(auVar15);
    auVar95 = vsubps_avx(local_300,_local_320);
    auVar88._0_4_ = auVar15._0_4_ * auVar18._0_4_;
    auVar88._4_4_ = auVar15._4_4_ * auVar18._4_4_;
    auVar88._8_4_ = auVar15._8_4_ * auVar18._8_4_;
    auVar88._12_4_ = auVar15._12_4_ * auVar18._12_4_;
    auVar88._16_4_ = auVar18._16_4_ * 0.0;
    auVar88._20_4_ = auVar18._20_4_ * 0.0;
    auVar88._24_4_ = auVar18._24_4_ * 0.0;
    auVar88._28_4_ = 0;
    fVar196 = auVar95._0_4_;
    auVar108._0_4_ = fVar196 * auVar16._0_4_;
    fVar204 = auVar95._4_4_;
    auVar108._4_4_ = fVar204 * auVar16._4_4_;
    fVar205 = auVar95._8_4_;
    auVar108._8_4_ = fVar205 * auVar16._8_4_;
    fVar206 = auVar95._12_4_;
    auVar108._12_4_ = fVar206 * auVar16._12_4_;
    fVar207 = auVar95._16_4_;
    auVar108._16_4_ = fVar207 * 0.0;
    fVar208 = auVar95._20_4_;
    auVar108._20_4_ = fVar208 * 0.0;
    fVar209 = auVar95._24_4_;
    auVar108._24_4_ = fVar209 * 0.0;
    auVar108._28_4_ = 0;
    auVar88 = vsubps_avx(auVar88,auVar108);
    auVar15 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar102 = auVar15._0_8_;
    local_80._8_8_ = uVar102;
    local_80._0_8_ = uVar102;
    local_80._16_8_ = uVar102;
    local_80._24_8_ = uVar102;
    auVar16 = vpermilps_avx(local_5f0,0xff);
    uVar102 = auVar16._0_8_;
    local_a0._8_8_ = uVar102;
    local_a0._0_8_ = uVar102;
    local_a0._16_8_ = uVar102;
    local_a0._24_8_ = uVar102;
    auVar16 = vpermilps_avx(local_600,0xff);
    uVar102 = auVar16._0_8_;
    local_c0._8_8_ = uVar102;
    local_c0._0_8_ = uVar102;
    local_c0._16_8_ = uVar102;
    local_c0._24_8_ = uVar102;
    auVar16 = vpermilps_avx(_local_500,0xff);
    local_e0 = auVar16._0_8_;
    local_800 = auVar71._0_4_;
    fStack_7fc = auVar71._4_4_;
    fStack_7f8 = auVar71._8_4_;
    fStack_7f4 = auVar71._12_4_;
    fStack_7f0 = auVar71._16_4_;
    fStack_7ec = auVar71._20_4_;
    fStack_7e8 = auVar71._24_4_;
    fVar119 = auVar16._0_4_;
    fVar117 = auVar16._4_4_;
    auVar13._4_4_ = fVar117 * fStack_7fc;
    auVar13._0_4_ = fVar119 * local_800;
    auVar13._8_4_ = fVar119 * fStack_7f8;
    auVar13._12_4_ = fVar117 * fStack_7f4;
    auVar13._16_4_ = fVar119 * fStack_7f0;
    auVar13._20_4_ = fVar117 * fStack_7ec;
    auVar13._24_4_ = fVar119 * fStack_7e8;
    auVar13._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar13,local_c0,auVar138);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar149,local_a0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar159,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar20._4_4_ = fVar117 * fVar96;
    auVar20._0_4_ = fVar119 * fVar118;
    auVar20._8_4_ = fVar119 * fVar97;
    auVar20._12_4_ = fVar117 * fVar98;
    auVar20._16_4_ = fVar119 * fVar99;
    auVar20._20_4_ = fVar117 * fVar100;
    auVar20._24_4_ = fVar119 * fVar101;
    auVar20._28_4_ = auVar159._28_4_;
    auVar16 = vfmadd231ps_fma(auVar20,local_340,local_c0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar94,local_a0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar112,local_80);
    auVar114._4_4_ = fVar204 * fVar204;
    auVar114._0_4_ = fVar196 * fVar196;
    auVar114._8_4_ = fVar205 * fVar205;
    auVar114._12_4_ = fVar206 * fVar206;
    auVar114._16_4_ = fVar207 * fVar207;
    auVar114._20_4_ = fVar208 * fVar208;
    auVar114._24_4_ = fVar209 * fVar209;
    auVar114._28_4_ = auVar15._4_4_;
    auVar15 = vfmadd231ps_fma(auVar114,auVar18,auVar18);
    auVar13 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar16));
    auVar129._4_4_ = auVar13._4_4_ * auVar13._4_4_ * auVar15._4_4_;
    auVar129._0_4_ = auVar13._0_4_ * auVar13._0_4_ * auVar15._0_4_;
    auVar129._8_4_ = auVar13._8_4_ * auVar13._8_4_ * auVar15._8_4_;
    auVar129._12_4_ = auVar13._12_4_ * auVar13._12_4_ * auVar15._12_4_;
    auVar129._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
    auVar129._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
    auVar129._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
    auVar129._28_4_ = auVar13._28_4_;
    auVar180._4_4_ = auVar88._4_4_ * auVar88._4_4_;
    auVar180._0_4_ = auVar88._0_4_ * auVar88._0_4_;
    auVar180._8_4_ = auVar88._8_4_ * auVar88._8_4_;
    auVar180._12_4_ = auVar88._12_4_ * auVar88._12_4_;
    auVar180._16_4_ = auVar88._16_4_ * auVar88._16_4_;
    auVar180._20_4_ = auVar88._20_4_ * auVar88._20_4_;
    auVar180._24_4_ = auVar88._24_4_ * auVar88._24_4_;
    auVar180._28_4_ = auVar88._28_4_;
    auVar13 = vcmpps_avx(auVar180,auVar129,2);
    fVar119 = auVar146._0_4_ * 4.7683716e-07;
    auVar89._0_4_ = (float)iVar10;
    register0x00001504 = auVar120._4_12_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    auVar88 = vcmpps_avx(_DAT_01f7b060,auVar89,1);
    auVar146 = vpermilps_avx(auVar17,0xaa);
    uVar102 = auVar146._0_8_;
    auVar134._8_8_ = uVar102;
    auVar134._0_8_ = uVar102;
    auVar134._16_8_ = uVar102;
    auVar134._24_8_ = uVar102;
    auVar146 = vpermilps_avx(auVar86,0xaa);
    uVar102 = auVar146._0_8_;
    local_240._8_8_ = uVar102;
    local_240._0_8_ = uVar102;
    local_240._16_8_ = uVar102;
    local_240._24_8_ = uVar102;
    auVar146 = vpermilps_avx(auVar85,0xaa);
    uVar102 = auVar146._0_8_;
    local_460._8_8_ = uVar102;
    local_460._0_8_ = uVar102;
    local_460._16_8_ = uVar102;
    local_460._24_8_ = uVar102;
    auVar146 = vshufps_avx(auVar120,auVar120,0xaa);
    uVar102 = auVar146._0_8_;
    register0x00001508 = uVar102;
    local_520 = uVar102;
    register0x00001510 = uVar102;
    register0x00001518 = uVar102;
    auVar194 = ZEXT3264(_local_520);
    auVar20 = auVar88 & auVar13;
    uVar5 = *(uint *)(ray + k * 4 + 0x30);
    local_560._0_16_ = ZEXT416(uVar5);
    local_480._0_16_ = ZEXT416(uVar77);
    fStack_65c = local_660;
    fStack_658 = local_660;
    fStack_654 = local_660;
    fStack_650 = local_660;
    fStack_64c = local_660;
    fStack_648 = local_660;
    fStack_644 = local_660;
    local_530._0_4_ = auVar89._0_4_;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0x7f,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar20 >> 0xbf,0) == '\0') &&
        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f]) {
      uVar76 = 0;
      auVar190 = ZEXT3264(local_6c0);
      auVar184 = ZEXT3264(local_720);
      auVar116 = ZEXT3264(local_680);
      auVar203 = ZEXT3264(local_6e0);
      auVar139 = ZEXT3264(local_620);
      auVar174 = ZEXT3264(CONCAT428(local_660,
                                    CONCAT424(local_660,
                                              CONCAT420(local_660,
                                                        CONCAT416(local_660,
                                                                  CONCAT412(local_660,
                                                                            CONCAT48(local_660,
                                                                                     CONCAT44(
                                                  local_660,local_660))))))));
      auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(fVar132,
                                                  CONCAT412(fVar140,CONCAT48(fVar132,uVar82)))))));
      auVar197 = ZEXT3264(local_700);
    }
    else {
      local_360 = vandps_avx(auVar13,auVar88);
      fVar117 = auVar146._0_4_;
      fVar196 = auVar146._4_4_;
      auVar165._4_4_ = fVar196 * fVar96;
      auVar165._0_4_ = fVar117 * fVar118;
      auVar165._8_4_ = fVar117 * fVar97;
      auVar165._12_4_ = fVar196 * fVar98;
      auVar165._16_4_ = fVar117 * fVar99;
      auVar165._20_4_ = fVar196 * fVar100;
      auVar165._24_4_ = fVar117 * fVar101;
      auVar165._28_4_ = local_360._28_4_;
      auVar146 = vfmadd213ps_fma(local_340,local_460,auVar165);
      auVar146 = vfmadd213ps_fma(auVar94,local_240,ZEXT1632(auVar146));
      auVar146 = vfmadd213ps_fma(auVar112,auVar134,ZEXT1632(auVar146));
      auVar90._0_4_ = fVar117 * local_800;
      auVar90._4_4_ = fVar196 * fStack_7fc;
      auVar90._8_4_ = fVar117 * fStack_7f8;
      auVar90._12_4_ = fVar196 * fStack_7f4;
      auVar90._16_4_ = fVar117 * fStack_7f0;
      auVar90._20_4_ = fVar196 * fStack_7ec;
      auVar90._24_4_ = fVar117 * fStack_7e8;
      auVar90._28_4_ = 0;
      auVar15 = vfmadd213ps_fma(auVar138,local_460,auVar90);
      auVar15 = vfmadd213ps_fma(auVar149,local_240,ZEXT1632(auVar15));
      auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1210);
      auVar149 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1694);
      auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1b18);
      fVar118 = *(float *)(bspline_basis0 + lVar81 + 0x1f9c);
      fVar96 = *(float *)(bspline_basis0 + lVar81 + 0x1fa0);
      fVar97 = *(float *)(bspline_basis0 + lVar81 + 0x1fa4);
      fVar98 = *(float *)(bspline_basis0 + lVar81 + 0x1fa8);
      fVar99 = *(float *)(bspline_basis0 + lVar81 + 0x1fac);
      fVar100 = *(float *)(bspline_basis0 + lVar81 + 0x1fb0);
      fVar101 = *(float *)(bspline_basis0 + lVar81 + 0x1fb4);
      auVar155._0_4_ = fVar118 * local_660;
      auVar155._4_4_ = fVar96 * local_660;
      auVar155._8_4_ = fVar97 * local_660;
      auVar155._12_4_ = fVar98 * local_660;
      auVar155._16_4_ = fVar99 * local_660;
      auVar155._20_4_ = fVar100 * local_660;
      auVar155._24_4_ = fVar101 * local_660;
      auVar155._28_4_ = 0;
      auVar175._0_4_ = fVar118 * fVar132;
      auVar175._4_4_ = fVar96 * fVar140;
      auVar175._8_4_ = fVar97 * fVar132;
      auVar175._12_4_ = fVar98 * fVar140;
      auVar175._16_4_ = fVar99 * fVar132;
      auVar175._20_4_ = fVar100 * fVar140;
      auVar175._24_4_ = fVar101 * fVar132;
      auVar175._28_4_ = 0;
      auVar19._4_4_ = fVar196 * fVar96;
      auVar19._0_4_ = fVar117 * fVar118;
      auVar19._8_4_ = fVar117 * fVar97;
      auVar19._12_4_ = fVar196 * fVar98;
      auVar19._16_4_ = fVar117 * fVar99;
      auVar19._20_4_ = fVar196 * fVar100;
      auVar19._24_4_ = fVar117 * fVar101;
      auVar19._28_4_ = auVar18._28_4_;
      auVar17 = vfmadd231ps_fma(auVar155,auVar94,local_6e0);
      auVar86 = vfmadd231ps_fma(auVar175,auVar94,local_620);
      auVar85 = vfmadd231ps_fma(auVar19,local_460,auVar94);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar149,local_700);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar149,local_680);
      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_240,auVar149);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar138,auVar200);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar138,local_4a0);
      auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar134,auVar138);
      fVar118 = *(float *)(bspline_basis1 + lVar81 + 0x1f9c);
      fVar96 = *(float *)(bspline_basis1 + lVar81 + 0x1fa0);
      fVar97 = *(float *)(bspline_basis1 + lVar81 + 0x1fa4);
      fVar98 = *(float *)(bspline_basis1 + lVar81 + 0x1fa8);
      fVar99 = *(float *)(bspline_basis1 + lVar81 + 0x1fac);
      fVar100 = *(float *)(bspline_basis1 + lVar81 + 0x1fb0);
      fVar101 = *(float *)(bspline_basis1 + lVar81 + 0x1fb4);
      auVar150._4_4_ = fVar96 * local_660;
      auVar150._0_4_ = fVar118 * local_660;
      auVar150._8_4_ = fVar97 * local_660;
      auVar150._12_4_ = fVar98 * local_660;
      auVar150._16_4_ = fVar99 * local_660;
      auVar150._20_4_ = fVar100 * local_660;
      auVar150._24_4_ = fVar101 * local_660;
      auVar150._28_4_ = auVar138._28_4_;
      auVar173._4_4_ = fVar96 * fVar140;
      auVar173._0_4_ = fVar118 * fVar132;
      auVar173._8_4_ = fVar97 * fVar132;
      auVar173._12_4_ = fVar98 * fVar140;
      auVar173._16_4_ = fVar99 * fVar132;
      auVar173._20_4_ = fVar100 * fVar140;
      auVar173._24_4_ = fVar101 * fVar132;
      auVar173._28_4_ = fVar196;
      auVar22._4_4_ = fVar196 * fVar96;
      auVar22._0_4_ = fVar117 * fVar118;
      auVar22._8_4_ = fVar117 * fVar97;
      auVar22._12_4_ = fVar196 * fVar98;
      auVar22._16_4_ = fVar117 * fVar99;
      auVar22._20_4_ = fVar196 * fVar100;
      auVar22._24_4_ = fVar117 * fVar101;
      auVar22._28_4_ = auVar14._4_4_;
      auVar138 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar150,auVar138,local_6e0);
      auVar120 = vfmadd231ps_fma(auVar173,auVar138,local_620);
      auVar104 = vfmadd231ps_fma(auVar22,auVar138,local_460);
      auVar138 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar138,local_700);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar138,local_680);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_240,auVar138);
      auVar138 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar138,auVar200);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar138,local_4a0);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar109._16_4_ = 0x7fffffff;
      auVar109._20_4_ = 0x7fffffff;
      auVar109._24_4_ = 0x7fffffff;
      auVar109._28_4_ = 0x7fffffff;
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar134,auVar138);
      auVar138 = vandps_avx(ZEXT1632(auVar17),auVar109);
      auVar149 = vandps_avx(ZEXT1632(auVar86),auVar109);
      auVar149 = vmaxps_avx(auVar138,auVar149);
      auVar138 = vandps_avx(ZEXT1632(auVar85),auVar109);
      auVar138 = vmaxps_avx(auVar149,auVar138);
      auVar127._4_4_ = fVar119;
      auVar127._0_4_ = fVar119;
      auVar127._8_4_ = fVar119;
      auVar127._12_4_ = fVar119;
      auVar127._16_4_ = fVar119;
      auVar127._20_4_ = fVar119;
      auVar127._24_4_ = fVar119;
      auVar127._28_4_ = fVar119;
      auVar138 = vcmpps_avx(auVar138,auVar127,1);
      auVar94 = vblendvps_avx(ZEXT1632(auVar17),auVar18,auVar138);
      auVar112 = vblendvps_avx(ZEXT1632(auVar86),auVar95,auVar138);
      auVar138 = vandps_avx(ZEXT1632(auVar14),auVar109);
      auVar149 = vandps_avx(ZEXT1632(auVar120),auVar109);
      auVar13 = vmaxps_avx(auVar138,auVar149);
      auVar138 = vandps_avx(ZEXT1632(auVar104),auVar109);
      auVar138 = vmaxps_avx(auVar13,auVar138);
      auVar88 = vcmpps_avx(auVar138,auVar127,1);
      auVar138 = vblendvps_avx(ZEXT1632(auVar14),auVar18,auVar88);
      auVar13 = vblendvps_avx(ZEXT1632(auVar120),auVar95,auVar88);
      auVar14 = vfmadd213ps_fma(auVar159,auVar134,ZEXT1632(auVar15));
      auVar15 = vfmadd213ps_fma(auVar94,auVar94,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,auVar112);
      auVar159 = vrsqrtps_avx(ZEXT1632(auVar15));
      fVar118 = auVar159._0_4_;
      fVar96 = auVar159._4_4_;
      fVar97 = auVar159._8_4_;
      fVar98 = auVar159._12_4_;
      fVar99 = auVar159._16_4_;
      fVar100 = auVar159._20_4_;
      fVar101 = auVar159._24_4_;
      auVar18._4_4_ = fVar96 * fVar96 * fVar96 * auVar15._4_4_ * -0.5;
      auVar18._0_4_ = fVar118 * fVar118 * fVar118 * auVar15._0_4_ * -0.5;
      auVar18._8_4_ = fVar97 * fVar97 * fVar97 * auVar15._8_4_ * -0.5;
      auVar18._12_4_ = fVar98 * fVar98 * fVar98 * auVar15._12_4_ * -0.5;
      auVar18._16_4_ = fVar99 * fVar99 * fVar99 * -0.0;
      auVar18._20_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar18._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
      auVar18._28_4_ = auVar149._28_4_;
      auVar201._8_4_ = 0x3fc00000;
      auVar201._0_8_ = 0x3fc000003fc00000;
      auVar201._12_4_ = 0x3fc00000;
      auVar201._16_4_ = 0x3fc00000;
      auVar201._20_4_ = 0x3fc00000;
      auVar201._24_4_ = 0x3fc00000;
      auVar201._28_4_ = 0x3fc00000;
      auVar15 = vfmadd231ps_fma(auVar18,auVar201,auVar159);
      fVar118 = auVar15._0_4_;
      fVar96 = auVar15._4_4_;
      auVar95._4_4_ = fVar96 * auVar112._4_4_;
      auVar95._0_4_ = fVar118 * auVar112._0_4_;
      fVar97 = auVar15._8_4_;
      auVar95._8_4_ = fVar97 * auVar112._8_4_;
      fVar98 = auVar15._12_4_;
      auVar95._12_4_ = fVar98 * auVar112._12_4_;
      auVar95._16_4_ = auVar112._16_4_ * 0.0;
      auVar95._20_4_ = auVar112._20_4_ * 0.0;
      auVar95._24_4_ = auVar112._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      auVar23._4_4_ = fVar96 * -auVar94._4_4_;
      auVar23._0_4_ = fVar118 * -auVar94._0_4_;
      auVar23._8_4_ = fVar97 * -auVar94._8_4_;
      auVar23._12_4_ = fVar98 * -auVar94._12_4_;
      auVar23._16_4_ = -auVar94._16_4_ * 0.0;
      auVar23._20_4_ = -auVar94._20_4_ * 0.0;
      auVar23._24_4_ = -auVar94._24_4_ * 0.0;
      auVar23._28_4_ = auVar159._28_4_;
      auVar15 = vfmadd213ps_fma(auVar138,auVar138,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar13,auVar13);
      auVar149 = vrsqrtps_avx(ZEXT1632(auVar15));
      auVar24._28_4_ = auVar88._28_4_;
      auVar24._0_28_ =
           ZEXT1628(CONCAT412(fVar98 * 0.0,
                              CONCAT48(fVar97 * 0.0,CONCAT44(fVar96 * 0.0,fVar118 * 0.0))));
      fVar118 = auVar149._0_4_;
      fVar96 = auVar149._4_4_;
      fVar97 = auVar149._8_4_;
      fVar98 = auVar149._12_4_;
      fVar99 = auVar149._16_4_;
      fVar100 = auVar149._20_4_;
      fVar101 = auVar149._24_4_;
      auVar25._4_4_ = fVar96 * fVar96 * fVar96 * auVar15._4_4_ * -0.5;
      auVar25._0_4_ = fVar118 * fVar118 * fVar118 * auVar15._0_4_ * -0.5;
      auVar25._8_4_ = fVar97 * fVar97 * fVar97 * auVar15._8_4_ * -0.5;
      auVar25._12_4_ = fVar98 * fVar98 * fVar98 * auVar15._12_4_ * -0.5;
      auVar25._16_4_ = fVar99 * fVar99 * fVar99 * -0.0;
      auVar25._20_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar25._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
      auVar25._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar25,auVar201,auVar149);
      fVar118 = auVar15._0_4_;
      auVar186._0_4_ = auVar13._0_4_ * fVar118;
      fVar96 = auVar15._4_4_;
      auVar186._4_4_ = auVar13._4_4_ * fVar96;
      fVar97 = auVar15._8_4_;
      auVar186._8_4_ = auVar13._8_4_ * fVar97;
      fVar98 = auVar15._12_4_;
      auVar186._12_4_ = auVar13._12_4_ * fVar98;
      auVar186._16_4_ = auVar13._16_4_ * 0.0;
      auVar186._20_4_ = auVar13._20_4_ * 0.0;
      auVar186._24_4_ = auVar13._24_4_ * 0.0;
      auVar186._28_4_ = 0;
      auVar26._4_4_ = -auVar138._4_4_ * fVar96;
      auVar26._0_4_ = -auVar138._0_4_ * fVar118;
      auVar26._8_4_ = -auVar138._8_4_ * fVar97;
      auVar26._12_4_ = -auVar138._12_4_ * fVar98;
      auVar26._16_4_ = -auVar138._16_4_ * 0.0;
      auVar26._20_4_ = -auVar138._20_4_ * 0.0;
      auVar26._24_4_ = -auVar138._24_4_ * 0.0;
      auVar26._28_4_ = auVar13._28_4_;
      auVar138._28_4_ = auVar149._28_4_;
      auVar138._0_28_ =
           ZEXT1628(CONCAT412(fVar98 * 0.0,
                              CONCAT48(fVar97 * 0.0,CONCAT44(fVar96 * 0.0,fVar118 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar95,ZEXT1632(auVar12),local_2c0);
      auVar149 = ZEXT1632(auVar12);
      auVar17 = vfmadd213ps_fma(auVar23,auVar149,_local_320);
      auVar86 = vfmadd213ps_fma(auVar24,auVar149,ZEXT1632(auVar14));
      auVar120 = vfnmadd213ps_fma(auVar95,auVar149,local_2c0);
      auVar85 = vfmadd213ps_fma(auVar186,ZEXT1632(auVar16),local_2e0);
      auVar104 = vfnmadd213ps_fma(auVar23,auVar149,_local_320);
      auVar173 = ZEXT1632(auVar16);
      auVar16 = vfmadd213ps_fma(auVar26,auVar173,local_300);
      auVar150 = ZEXT1632(auVar12);
      auVar133 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar150,auVar24);
      auVar12 = vfmadd213ps_fma(auVar138,auVar173,ZEXT1632(auVar146));
      auVar84 = vfnmadd213ps_fma(auVar186,auVar173,local_2e0);
      auVar105 = vfnmadd213ps_fma(auVar26,auVar173,local_300);
      auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar146),auVar173,auVar138);
      auVar138 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar104));
      auVar149 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar133));
      auVar27._4_4_ = auVar133._4_4_ * auVar138._4_4_;
      auVar27._0_4_ = auVar133._0_4_ * auVar138._0_4_;
      auVar27._8_4_ = auVar133._8_4_ * auVar138._8_4_;
      auVar27._12_4_ = auVar133._12_4_ * auVar138._12_4_;
      auVar27._16_4_ = auVar138._16_4_ * 0.0;
      auVar27._20_4_ = auVar138._20_4_ * 0.0;
      auVar27._24_4_ = auVar138._24_4_ * 0.0;
      auVar27._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar27,ZEXT1632(auVar104),auVar149);
      auVar28._4_4_ = auVar149._4_4_ * auVar120._4_4_;
      auVar28._0_4_ = auVar149._0_4_ * auVar120._0_4_;
      auVar28._8_4_ = auVar149._8_4_ * auVar120._8_4_;
      auVar28._12_4_ = auVar149._12_4_ * auVar120._12_4_;
      auVar28._16_4_ = auVar149._16_4_ * 0.0;
      auVar28._20_4_ = auVar149._20_4_ * 0.0;
      auVar28._24_4_ = auVar149._24_4_ * 0.0;
      auVar28._28_4_ = auVar149._28_4_;
      auVar149 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar120));
      auVar146 = vfmsub231ps_fma(auVar28,ZEXT1632(auVar133),auVar149);
      auVar29._4_4_ = auVar104._4_4_ * auVar149._4_4_;
      auVar29._0_4_ = auVar104._0_4_ * auVar149._0_4_;
      auVar29._8_4_ = auVar104._8_4_ * auVar149._8_4_;
      auVar29._12_4_ = auVar104._12_4_ * auVar149._12_4_;
      auVar29._16_4_ = auVar149._16_4_ * 0.0;
      auVar29._20_4_ = auVar149._20_4_ * 0.0;
      auVar29._24_4_ = auVar149._24_4_ * 0.0;
      auVar29._28_4_ = auVar149._28_4_;
      auVar88 = ZEXT1632(auVar120);
      auVar120 = vfmsub231ps_fma(auVar29,auVar88,auVar138);
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar120),ZEXT832(0) << 0x20,ZEXT1632(auVar146));
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar20 = vcmpps_avx(ZEXT1632(auVar146),ZEXT832(0) << 0x20,2);
      auVar138 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar15),auVar20);
      auVar149 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar17),auVar20);
      auVar159 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar86),auVar20);
      auVar94 = vblendvps_avx(auVar88,ZEXT1632(auVar85),auVar20);
      auVar112 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar16),auVar20);
      auVar13 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar12),auVar20);
      auVar88 = vblendvps_avx(ZEXT1632(auVar85),auVar88,auVar20);
      auVar18 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar104),auVar20);
      auVar146 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      auVar95 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar133),auVar20);
      auVar114 = vsubps_avx(auVar88,auVar138);
      auVar129 = vsubps_avx(auVar18,auVar149);
      auVar180 = vsubps_avx(auVar95,auVar159);
      auVar108 = vsubps_avx(auVar138,auVar94);
      auVar165 = vsubps_avx(auVar149,auVar112);
      auVar19 = vsubps_avx(auVar159,auVar13);
      auVar30._4_4_ = auVar180._4_4_ * auVar138._4_4_;
      auVar30._0_4_ = auVar180._0_4_ * auVar138._0_4_;
      auVar30._8_4_ = auVar180._8_4_ * auVar138._8_4_;
      auVar30._12_4_ = auVar180._12_4_ * auVar138._12_4_;
      auVar30._16_4_ = auVar180._16_4_ * auVar138._16_4_;
      auVar30._20_4_ = auVar180._20_4_ * auVar138._20_4_;
      auVar30._24_4_ = auVar180._24_4_ * auVar138._24_4_;
      auVar30._28_4_ = auVar95._28_4_;
      auVar12 = vfmsub231ps_fma(auVar30,auVar159,auVar114);
      auVar31._4_4_ = auVar114._4_4_ * auVar149._4_4_;
      auVar31._0_4_ = auVar114._0_4_ * auVar149._0_4_;
      auVar31._8_4_ = auVar114._8_4_ * auVar149._8_4_;
      auVar31._12_4_ = auVar114._12_4_ * auVar149._12_4_;
      auVar31._16_4_ = auVar114._16_4_ * auVar149._16_4_;
      auVar31._20_4_ = auVar114._20_4_ * auVar149._20_4_;
      auVar31._24_4_ = auVar114._24_4_ * auVar149._24_4_;
      auVar31._28_4_ = auVar88._28_4_;
      auVar14 = vfmsub231ps_fma(auVar31,auVar138,auVar129);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar91._0_4_ = auVar129._0_4_ * auVar159._0_4_;
      auVar91._4_4_ = auVar129._4_4_ * auVar159._4_4_;
      auVar91._8_4_ = auVar129._8_4_ * auVar159._8_4_;
      auVar91._12_4_ = auVar129._12_4_ * auVar159._12_4_;
      auVar91._16_4_ = auVar129._16_4_ * auVar159._16_4_;
      auVar91._20_4_ = auVar129._20_4_ * auVar159._20_4_;
      auVar91._24_4_ = auVar129._24_4_ * auVar159._24_4_;
      auVar91._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar91,auVar149,auVar180);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar92._0_4_ = auVar19._0_4_ * auVar94._0_4_;
      auVar92._4_4_ = auVar19._4_4_ * auVar94._4_4_;
      auVar92._8_4_ = auVar19._8_4_ * auVar94._8_4_;
      auVar92._12_4_ = auVar19._12_4_ * auVar94._12_4_;
      auVar92._16_4_ = auVar19._16_4_ * auVar94._16_4_;
      auVar92._20_4_ = auVar19._20_4_ * auVar94._20_4_;
      auVar92._24_4_ = auVar19._24_4_ * auVar94._24_4_;
      auVar92._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar92,auVar108,auVar13);
      auVar32._4_4_ = auVar165._4_4_ * auVar13._4_4_;
      auVar32._0_4_ = auVar165._0_4_ * auVar13._0_4_;
      auVar32._8_4_ = auVar165._8_4_ * auVar13._8_4_;
      auVar32._12_4_ = auVar165._12_4_ * auVar13._12_4_;
      auVar32._16_4_ = auVar165._16_4_ * auVar13._16_4_;
      auVar32._20_4_ = auVar165._20_4_ * auVar13._20_4_;
      auVar32._24_4_ = auVar165._24_4_ * auVar13._24_4_;
      auVar32._28_4_ = auVar13._28_4_;
      auVar15 = vfmsub231ps_fma(auVar32,auVar112,auVar19);
      auVar33._4_4_ = auVar108._4_4_ * auVar112._4_4_;
      auVar33._0_4_ = auVar108._0_4_ * auVar112._0_4_;
      auVar33._8_4_ = auVar108._8_4_ * auVar112._8_4_;
      auVar33._12_4_ = auVar108._12_4_ * auVar112._12_4_;
      auVar33._16_4_ = auVar108._16_4_ * auVar112._16_4_;
      auVar33._20_4_ = auVar108._20_4_ * auVar112._20_4_;
      auVar33._24_4_ = auVar108._24_4_ * auVar112._24_4_;
      auVar33._28_4_ = auVar18._28_4_;
      auVar16 = vfmsub231ps_fma(auVar33,auVar165,auVar94);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar94 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
      auVar94 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,2);
      auVar12 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
      auVar146 = vpand_avx(auVar12,auVar146);
      auVar94 = vpmovsxwd_avx2(auVar146);
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0x7f,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0xbf,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f])
      {
LAB_01128b8b:
        auVar174 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
      }
      else {
        auVar34._4_4_ = auVar129._4_4_ * auVar19._4_4_;
        auVar34._0_4_ = auVar129._0_4_ * auVar19._0_4_;
        auVar34._8_4_ = auVar129._8_4_ * auVar19._8_4_;
        auVar34._12_4_ = auVar129._12_4_ * auVar19._12_4_;
        auVar34._16_4_ = auVar129._16_4_ * auVar19._16_4_;
        auVar34._20_4_ = auVar129._20_4_ * auVar19._20_4_;
        auVar34._24_4_ = auVar129._24_4_ * auVar19._24_4_;
        auVar34._28_4_ = auVar94._28_4_;
        auVar86 = vfmsub231ps_fma(auVar34,auVar165,auVar180);
        auVar110._0_4_ = auVar180._0_4_ * auVar108._0_4_;
        auVar110._4_4_ = auVar180._4_4_ * auVar108._4_4_;
        auVar110._8_4_ = auVar180._8_4_ * auVar108._8_4_;
        auVar110._12_4_ = auVar180._12_4_ * auVar108._12_4_;
        auVar110._16_4_ = auVar180._16_4_ * auVar108._16_4_;
        auVar110._20_4_ = auVar180._20_4_ * auVar108._20_4_;
        auVar110._24_4_ = auVar180._24_4_ * auVar108._24_4_;
        auVar110._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar110,auVar114,auVar19);
        auVar35._4_4_ = auVar114._4_4_ * auVar165._4_4_;
        auVar35._0_4_ = auVar114._0_4_ * auVar165._0_4_;
        auVar35._8_4_ = auVar114._8_4_ * auVar165._8_4_;
        auVar35._12_4_ = auVar114._12_4_ * auVar165._12_4_;
        auVar35._16_4_ = auVar114._16_4_ * auVar165._16_4_;
        auVar35._20_4_ = auVar114._20_4_ * auVar165._20_4_;
        auVar35._24_4_ = auVar114._24_4_ * auVar165._24_4_;
        auVar35._28_4_ = auVar112._28_4_;
        auVar85 = vfmsub231ps_fma(auVar35,auVar108,auVar129);
        auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar17),ZEXT1632(auVar85));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar86),_DAT_01f7b000);
        auVar94 = vrcpps_avx(ZEXT1632(auVar16));
        auVar187._8_4_ = 0x3f800000;
        auVar187._0_8_ = 0x3f8000003f800000;
        auVar187._12_4_ = 0x3f800000;
        auVar187._16_4_ = 0x3f800000;
        auVar187._20_4_ = 0x3f800000;
        auVar187._24_4_ = 0x3f800000;
        auVar187._28_4_ = 0x3f800000;
        auVar12 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar16),auVar187);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar94,auVar94);
        auVar163._0_4_ = auVar85._0_4_ * auVar159._0_4_;
        auVar163._4_4_ = auVar85._4_4_ * auVar159._4_4_;
        auVar163._8_4_ = auVar85._8_4_ * auVar159._8_4_;
        auVar163._12_4_ = auVar85._12_4_ * auVar159._12_4_;
        auVar163._16_4_ = auVar159._16_4_ * 0.0;
        auVar163._20_4_ = auVar159._20_4_ * 0.0;
        auVar163._24_4_ = auVar159._24_4_ * 0.0;
        auVar163._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar163,auVar149,ZEXT1632(auVar17));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar86),auVar138);
        fVar118 = auVar12._0_4_;
        fVar96 = auVar12._4_4_;
        fVar97 = auVar12._8_4_;
        fVar98 = auVar12._12_4_;
        auVar159 = ZEXT1632(CONCAT412(fVar98 * auVar17._12_4_,
                                      CONCAT48(fVar97 * auVar17._8_4_,
                                               CONCAT44(fVar96 * auVar17._4_4_,
                                                        fVar118 * auVar17._0_4_))));
        auVar93._4_4_ = uVar5;
        auVar93._0_4_ = uVar5;
        auVar93._8_4_ = uVar5;
        auVar93._12_4_ = uVar5;
        auVar93._16_4_ = uVar5;
        auVar93._20_4_ = uVar5;
        auVar93._24_4_ = uVar5;
        auVar93._28_4_ = uVar5;
        uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar111._4_4_ = uVar72;
        auVar111._0_4_ = uVar72;
        auVar111._8_4_ = uVar72;
        auVar111._12_4_ = uVar72;
        auVar111._16_4_ = uVar72;
        auVar111._20_4_ = uVar72;
        auVar111._24_4_ = uVar72;
        auVar111._28_4_ = uVar72;
        auVar138 = vcmpps_avx(auVar93,auVar159,2);
        auVar149 = vcmpps_avx(auVar159,auVar111,2);
        auVar138 = vandps_avx(auVar149,auVar138);
        auVar12 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
        auVar146 = vpand_avx(auVar146,auVar12);
        auVar138 = vpmovsxwd_avx2(auVar146);
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar138 >> 0x7f,0) == '\0') &&
              (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0xbf,0) == '\0') &&
            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar138[0x1f]) goto LAB_01128b8b;
        auVar138 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
        auVar12 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
        auVar146 = vpand_avx(auVar146,auVar12);
        auVar138 = vpmovsxwd_avx2(auVar146);
        auVar174 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0x7f,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar138 >> 0xbf,0) != '\0') ||
            (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar138[0x1f] < '\0') {
          auVar94 = ZEXT1632(CONCAT412(fVar98 * auVar14._12_4_,
                                       CONCAT48(fVar97 * auVar14._8_4_,
                                                CONCAT44(fVar96 * auVar14._4_4_,
                                                         fVar118 * auVar14._0_4_))));
          auVar112 = ZEXT1632(CONCAT412(fVar98 * auVar15._12_4_,
                                        CONCAT48(fVar97 * auVar15._8_4_,
                                                 CONCAT44(fVar96 * auVar15._4_4_,
                                                          fVar118 * auVar15._0_4_))));
          auVar151._8_4_ = 0x3f800000;
          auVar151._0_8_ = 0x3f8000003f800000;
          auVar151._12_4_ = 0x3f800000;
          auVar151._16_4_ = 0x3f800000;
          auVar151._20_4_ = 0x3f800000;
          auVar151._24_4_ = 0x3f800000;
          auVar151._28_4_ = 0x3f800000;
          auVar149 = vsubps_avx(auVar151,auVar94);
          _local_260 = vblendvps_avx(auVar149,auVar94,auVar20);
          auVar149 = vsubps_avx(auVar151,auVar112);
          local_380 = vblendvps_avx(auVar149,auVar112,auVar20);
          auVar174 = ZEXT3264(auVar138);
          local_280 = auVar159;
        }
      }
      auVar203 = ZEXT3264(local_6e0);
      auVar197 = ZEXT3264(local_700);
      auVar194 = ZEXT3264(_local_520);
      auVar190 = ZEXT3264(local_6c0);
      auVar116 = ZEXT3264(auVar134);
      auVar184 = ZEXT3264(local_720);
      auVar138 = auVar174._0_32_;
      if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar138 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar138 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar174[0x1f]) {
        auVar174 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
      }
      else {
        auVar149 = vsubps_avx(auVar173,auVar150);
        auVar146 = vfmadd213ps_fma(auVar149,_local_260,auVar150);
        fVar118 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar36._4_4_ = (auVar146._4_4_ + auVar146._4_4_) * fVar118;
        auVar36._0_4_ = (auVar146._0_4_ + auVar146._0_4_) * fVar118;
        auVar36._8_4_ = (auVar146._8_4_ + auVar146._8_4_) * fVar118;
        auVar36._12_4_ = (auVar146._12_4_ + auVar146._12_4_) * fVar118;
        auVar36._16_4_ = fVar118 * 0.0;
        auVar36._20_4_ = fVar118 * 0.0;
        auVar36._24_4_ = fVar118 * 0.0;
        auVar36._28_4_ = 0;
        auVar149 = vcmpps_avx(local_280,auVar36,6);
        auVar159 = auVar138 & auVar149;
        auVar174 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0x7f,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0xbf,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar159[0x1f] < '\0') {
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar113._16_4_ = 0xbf800000;
          auVar113._20_4_ = 0xbf800000;
          auVar113._24_4_ = 0xbf800000;
          auVar113._28_4_ = 0xbf800000;
          auVar128._8_4_ = 0x40000000;
          auVar128._0_8_ = 0x4000000040000000;
          auVar128._12_4_ = 0x40000000;
          auVar128._16_4_ = 0x40000000;
          auVar128._20_4_ = 0x40000000;
          auVar128._24_4_ = 0x40000000;
          auVar128._28_4_ = 0x40000000;
          auVar146 = vfmadd213ps_fma(local_380,auVar128,auVar113);
          local_220 = _local_260;
          local_200 = ZEXT1632(auVar146);
          local_1e0 = local_280;
          local_1c0 = 0;
          local_1a0 = local_5f0._0_8_;
          uStack_198 = local_5f0._8_8_;
          local_190 = local_600._0_8_;
          uStack_188 = local_600._8_8_;
          local_380 = local_200;
          if ((local_4c0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar76 = 0;
            auVar139 = ZEXT3264(local_620);
            auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(
                                                  fVar132,CONCAT412(fVar140,CONCAT48(fVar132,uVar82)
                                                                   ))))));
          }
          else {
            auVar139 = ZEXT3264(local_620);
            auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(
                                                  fVar132,CONCAT412(fVar140,CONCAT48(fVar132,uVar82)
                                                                   ))))));
            pGVar74 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device != (Device *)0x0) ||
               (uVar76 = CONCAT71((int7)((ulong)local_4c0 >> 8),1), pGVar74 = local_4c0,
               local_4c0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar138 = vandps_avx(auVar149,auVar138);
              fVar118 = 1.0 / auVar89._0_4_;
              local_140[0] = fVar118 * ((float)local_260._0_4_ + 0.0);
              local_140[1] = fVar118 * ((float)local_260._4_4_ + 1.0);
              local_140[2] = fVar118 * (fStack_258 + 2.0);
              local_140[3] = fVar118 * (fStack_254 + 3.0);
              fStack_130 = fVar118 * (fStack_250 + 4.0);
              fStack_12c = fVar118 * (fStack_24c + 5.0);
              fStack_128 = fVar118 * (fStack_248 + 6.0);
              fStack_124 = fStack_244 + 7.0;
              local_380._0_8_ = auVar146._0_8_;
              local_380._8_8_ = auVar146._8_8_;
              local_120 = local_380._0_8_;
              uStack_118 = local_380._8_8_;
              uStack_110 = 0;
              uStack_108 = 0;
              local_100 = local_280;
              uVar72 = vmovmskps_avx(auVar138);
              uVar76 = 0;
              uVar78 = CONCAT44((int)((ulong)pGVar74 >> 0x20),uVar72);
              for (uVar21 = uVar78; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                uVar76 = uVar76 + 1;
              }
              local_6a0._0_8_ = CONCAT44(uVar9,uVar9);
              local_6a0._0_16_ = CONCAT412(uVar9,CONCAT48(uVar9,local_6a0._0_8_));
              local_6a0 = ZEXT1632(local_6a0._0_16_);
              local_580 = (undefined1  [8])CONCAT44(uVar77,uVar77);
              _local_580 = ZEXT1632(CONCAT412(uVar77,CONCAT48(uVar77,local_580)));
              local_5a0 = auVar134;
              local_1bc = iVar10;
              local_1b0 = local_630;
              uStack_1a8 = uStack_628;
              while (auVar134 = auVar116._0_32_, uVar78 != 0) {
                uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
                fVar118 = local_140[uVar76];
                local_400._4_4_ = fVar118;
                local_400._0_4_ = fVar118;
                local_400._8_4_ = fVar118;
                local_400._12_4_ = fVar118;
                local_3f0 = *(undefined4 *)((long)&local_120 + uVar76 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar76 * 4);
                fVar97 = 1.0 - fVar118;
                auVar146 = ZEXT416((uint)(fVar118 * fVar97 * 4.0));
                auVar12 = vfnmsub213ss_fma(local_400,local_400,auVar146);
                auVar146 = vfmadd213ss_fma(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),auVar146);
                fVar96 = auVar146._0_4_ * 0.5;
                fVar118 = fVar118 * fVar118 * 0.5;
                auVar144._0_4_ = fVar118 * (float)local_500._0_4_;
                auVar144._4_4_ = fVar118 * (float)local_500._4_4_;
                auVar144._8_4_ = fVar118 * fStack_4f8;
                auVar144._12_4_ = fVar118 * fStack_4f4;
                auVar121._4_4_ = fVar96;
                auVar121._0_4_ = fVar96;
                auVar121._8_4_ = fVar96;
                auVar121._12_4_ = fVar96;
                auVar146 = vfmadd132ps_fma(auVar121,auVar144,local_600);
                fVar118 = auVar12._0_4_ * 0.5;
                auVar145._4_4_ = fVar118;
                auVar145._0_4_ = fVar118;
                auVar145._8_4_ = fVar118;
                auVar145._12_4_ = fVar118;
                auVar146 = vfmadd132ps_fma(auVar145,auVar146,local_5f0);
                local_5d0.context = context->user;
                fVar118 = fVar97 * -fVar97 * 0.5;
                auVar122._4_4_ = fVar118;
                auVar122._0_4_ = fVar118;
                auVar122._8_4_ = fVar118;
                auVar122._12_4_ = fVar118;
                auVar69._8_8_ = uStack_628;
                auVar69._0_8_ = local_630;
                auVar146 = vfmadd132ps_fma(auVar122,auVar146,auVar69);
                local_430 = auVar146._0_4_;
                local_420 = vshufps_avx(auVar146,auVar146,0x55);
                local_410 = vshufps_avx(auVar146,auVar146,0xaa);
                local_3e0 = local_580;
                uStack_3d8 = uStack_578;
                local_3d0 = local_6a0._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_6a0._0_16_),ZEXT1632(local_6a0._0_16_));
                uStack_3bc = (local_5d0.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_5d0.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_740 = *local_5d8;
                local_5d0.valid = (int *)local_740;
                local_5d0.geometryUserPtr = local_4c0->userPtr;
                local_5d0.hit = (RTCHitN *)&local_430;
                local_5d0.N = 4;
                local_5d0.ray = (RTCRayN *)ray;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (local_4c0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_4c0->occlusionFilterN)(&local_5d0);
                  auVar194 = ZEXT3264(_local_520);
                  auVar116 = ZEXT3264(local_5a0);
                  auVar197 = ZEXT3264(local_700);
                  auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar203 = ZEXT3264(local_6e0);
                  auVar184 = ZEXT3264(local_720);
                  auVar190 = ZEXT3264(local_6c0);
                }
                if (local_740 == (undefined1  [16])0x0) {
                  auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar146 = auVar146 ^ _DAT_01f46b70;
                  auVar139 = ZEXT3264(local_620);
                  auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,
                                                  CONCAT416(fVar132,CONCAT412(fVar140,CONCAT48(
                                                  fVar132,uVar82)))))));
                }
                else {
                  p_Var11 = context->args->filter;
                  if (p_Var11 == (RTCFilterFunctionN)0x0) {
                    auVar139 = ZEXT3264(local_620);
                    auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,
                                                  CONCAT416(fVar132,CONCAT412(fVar140,CONCAT48(
                                                  fVar132,uVar82)))))));
                  }
                  else {
                    auVar139 = ZEXT3264(local_620);
                    auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,
                                                  CONCAT416(fVar132,CONCAT412(fVar140,CONCAT48(
                                                  fVar132,uVar82)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((local_4c0->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var11)(&local_5d0);
                      auVar194 = ZEXT3264(_local_520);
                      auVar116 = ZEXT3264(local_5a0);
                      auVar197 = ZEXT3264(local_700);
                      auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,
                                                  CONCAT416(fVar132,CONCAT412(fVar140,CONCAT48(
                                                  fVar132,uVar82)))))));
                      auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      auVar139 = ZEXT3264(local_620);
                      auVar203 = ZEXT3264(local_6e0);
                      auVar184 = ZEXT3264(local_720);
                      auVar190 = ZEXT3264(local_6c0);
                    }
                  }
                  auVar12 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                  auVar146 = auVar12 ^ _DAT_01f46b70;
                  auVar123._8_4_ = 0xff800000;
                  auVar123._0_8_ = 0xff800000ff800000;
                  auVar123._12_4_ = 0xff800000;
                  auVar12 = vblendvps_avx(auVar123,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                          auVar12);
                  *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar12;
                }
                auVar134 = auVar116._0_32_;
                auVar106._8_8_ = 0x100000001;
                auVar106._0_8_ = 0x100000001;
                if ((auVar106 & auVar146) != (undefined1  [16])0x0) {
                  uVar76 = CONCAT71((int7)(uVar76 >> 8),1);
                  goto LAB_01127d67;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar72;
                uVar21 = uVar76 & 0x3f;
                uVar76 = 0;
                uVar78 = uVar78 ^ 1L << uVar21;
                for (uVar21 = uVar78; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
                {
                  uVar76 = uVar76 + 1;
                }
              }
              uVar76 = 0;
            }
          }
LAB_01127d67:
          auVar116 = ZEXT3264(local_680);
          goto LAB_01127790;
        }
      }
      uVar76 = 0;
      auVar139 = ZEXT3264(local_620);
      auVar116 = ZEXT3264(local_680);
      auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(fVar132,
                                                  CONCAT412(fVar140,CONCAT48(fVar132,uVar82)))))));
    }
LAB_01127790:
    auVar138 = local_360;
    auVar131 = ZEXT464((uint)fVar119);
    if (8 < iVar10) {
      local_2c0._4_4_ = iVar10;
      local_2c0._0_4_ = iVar10;
      local_2c0._8_4_ = iVar10;
      local_2c0._12_4_ = iVar10;
      local_2c0._16_4_ = iVar10;
      local_2c0._20_4_ = iVar10;
      local_2c0._24_4_ = iVar10;
      local_2c0._28_4_ = iVar10;
      local_320._4_4_ = fVar119;
      local_320._0_4_ = fVar119;
      fStack_318 = fVar119;
      fStack_314 = fVar119;
      fStack_310 = fVar119;
      fStack_30c = fVar119;
      fStack_308 = fVar119;
      fStack_304 = fVar119;
      local_340._4_4_ = local_560._0_4_;
      local_340._0_4_ = local_560._0_4_;
      local_340._8_4_ = local_560._0_4_;
      local_340._12_4_ = local_560._0_4_;
      local_340._16_4_ = local_560._0_4_;
      local_340._20_4_ = local_560._0_4_;
      local_340._24_4_ = local_560._0_4_;
      local_340._28_4_ = local_560._0_4_;
      fStack_4b8 = 1.0 / (float)local_530._0_4_;
      local_530._4_4_ = (undefined4)local_728;
      local_530._0_4_ = (undefined4)local_728;
      uStack_528 = (undefined4)local_728;
      uStack_524 = (undefined4)local_728;
      local_360._4_4_ = local_480._0_4_;
      local_360._0_4_ = local_480._0_4_;
      local_360._8_4_ = local_480._0_4_;
      local_360._16_16_ = auVar138._16_16_;
      local_360._12_4_ = local_480._0_4_;
      _local_520 = auVar194._0_32_;
      local_5a0 = auVar134;
      fStack_4b4 = fStack_4b8;
      fStack_4b0 = fStack_4b8;
      fStack_4ac = fStack_4b8;
      fStack_4a8 = fStack_4b8;
      fStack_4a4 = fStack_4b8;
      local_4c0._0_4_ = fStack_4b8;
      local_4c0._4_4_ = fStack_4b8;
      for (lVar80 = 8; lVar80 < local_4f0; lVar80 = lVar80 + 8) {
        auVar180 = auVar184._0_32_;
        auVar138 = *(undefined1 (*) [32])(bspline_basis0 + lVar80 * 4 + lVar81);
        auVar149 = *(undefined1 (*) [32])(lVar81 + 0x21fffac + lVar80 * 4);
        auVar159 = *(undefined1 (*) [32])(lVar81 + 0x2200430 + lVar80 * 4);
        pauVar2 = (undefined1 (*) [28])(lVar81 + 0x22008b4 + lVar80 * 4);
        fVar101 = *(float *)*pauVar2;
        fVar117 = *(float *)(*pauVar2 + 4);
        fVar196 = *(float *)(*pauVar2 + 8);
        fVar204 = *(float *)(*pauVar2 + 0xc);
        fVar205 = *(float *)(*pauVar2 + 0x10);
        fVar206 = *(float *)(*pauVar2 + 0x14);
        fVar207 = *(float *)(*pauVar2 + 0x18);
        auVar71 = *pauVar2;
        auVar195._0_4_ = fVar101 * auVar174._0_4_;
        auVar195._4_4_ = fVar117 * auVar174._4_4_;
        auVar195._8_4_ = fVar196 * auVar174._8_4_;
        auVar195._12_4_ = fVar204 * auVar174._12_4_;
        auVar195._16_4_ = fVar205 * auVar174._16_4_;
        auVar195._20_4_ = fVar206 * auVar174._20_4_;
        auVar195._28_36_ = auVar194._28_36_;
        auVar195._24_4_ = fVar207 * auVar174._24_4_;
        auVar194._0_4_ = fVar101 * auVar168._0_4_;
        auVar194._4_4_ = fVar117 * auVar168._4_4_;
        auVar194._8_4_ = fVar196 * auVar168._8_4_;
        auVar194._12_4_ = fVar204 * auVar168._12_4_;
        auVar194._16_4_ = fVar205 * auVar168._16_4_;
        auVar194._20_4_ = fVar206 * auVar168._20_4_;
        auVar194._28_36_ = auVar131._28_36_;
        auVar194._24_4_ = fVar207 * auVar168._24_4_;
        auVar146 = vfmadd231ps_fma(auVar195._0_32_,auVar159,auVar203._0_32_);
        auVar12 = vfmadd231ps_fma(auVar194._0_32_,auVar159,auVar139._0_32_);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar149,auVar197._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar149,auVar116._0_32_);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar138,auVar200);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar138,local_4a0);
        auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar80 * 4 + lVar81);
        auVar112 = *(undefined1 (*) [32])(lVar81 + 0x22023cc + lVar80 * 4);
        auVar13 = *(undefined1 (*) [32])(lVar81 + 0x2202850 + lVar80 * 4);
        pfVar3 = (float *)(lVar81 + 0x2202cd4 + lVar80 * 4);
        fVar208 = *pfVar3;
        fVar209 = pfVar3[1];
        fVar64 = pfVar3[2];
        fVar65 = pfVar3[3];
        fVar66 = pfVar3[4];
        fVar67 = pfVar3[5];
        fVar68 = pfVar3[6];
        auVar131._0_4_ = fVar208 * auVar174._0_4_;
        auVar131._4_4_ = fVar209 * auVar174._4_4_;
        auVar131._8_4_ = fVar64 * auVar174._8_4_;
        auVar131._12_4_ = fVar65 * auVar174._12_4_;
        auVar131._16_4_ = fVar66 * auVar174._16_4_;
        auVar131._20_4_ = fVar67 * auVar174._20_4_;
        auVar131._28_36_ = auVar174._28_36_;
        auVar131._24_4_ = fVar68 * auVar174._24_4_;
        auVar174._0_4_ = fVar208 * auVar168._0_4_;
        auVar174._4_4_ = fVar209 * auVar168._4_4_;
        auVar174._8_4_ = fVar64 * auVar168._8_4_;
        auVar174._12_4_ = fVar65 * auVar168._12_4_;
        auVar174._16_4_ = fVar66 * auVar168._16_4_;
        auVar174._20_4_ = fVar67 * auVar168._20_4_;
        auVar174._28_36_ = auVar168._28_36_;
        auVar174._24_4_ = fVar68 * auVar168._24_4_;
        auVar14 = vfmadd231ps_fma(auVar131._0_32_,auVar13,auVar203._0_32_);
        auVar15 = vfmadd231ps_fma(auVar174._0_32_,auVar13,auVar139._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar112,auVar197._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,auVar116._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar94,auVar200);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar94,local_4a0);
        local_480 = ZEXT1632(auVar146);
        auVar18 = vsubps_avx(ZEXT1632(auVar14),local_480);
        local_560 = ZEXT1632(auVar15);
        auVar129 = ZEXT1632(auVar12);
        local_300 = vsubps_avx(local_560,auVar129);
        auVar37._4_4_ = auVar18._4_4_ * auVar12._4_4_;
        auVar37._0_4_ = auVar18._0_4_ * auVar12._0_4_;
        auVar37._8_4_ = auVar18._8_4_ * auVar12._8_4_;
        auVar37._12_4_ = auVar18._12_4_ * auVar12._12_4_;
        auVar37._16_4_ = auVar18._16_4_ * 0.0;
        auVar37._20_4_ = auVar18._20_4_ * 0.0;
        auVar37._24_4_ = auVar18._24_4_ * 0.0;
        auVar37._28_4_ = auVar203._28_4_;
        fVar119 = local_300._0_4_;
        auVar184._0_4_ = auVar146._0_4_ * fVar119;
        fVar118 = local_300._4_4_;
        auVar184._4_4_ = auVar146._4_4_ * fVar118;
        fVar96 = local_300._8_4_;
        auVar184._8_4_ = auVar146._8_4_ * fVar96;
        fVar97 = local_300._12_4_;
        auVar184._12_4_ = auVar146._12_4_ * fVar97;
        fVar98 = local_300._16_4_;
        auVar184._16_4_ = fVar98 * 0.0;
        fVar99 = local_300._20_4_;
        auVar184._20_4_ = fVar99 * 0.0;
        fVar100 = local_300._24_4_;
        auVar184._28_36_ = auVar116._28_36_;
        auVar184._24_4_ = fVar100 * 0.0;
        auVar194 = ZEXT3264(auVar159);
        auVar95 = vsubps_avx(auVar37,auVar184._0_32_);
        auVar164._0_4_ = fVar101 * (float)local_e0;
        auVar164._4_4_ = fVar117 * local_e0._4_4_;
        auVar164._8_4_ = fVar196 * (float)uStack_d8;
        auVar164._12_4_ = fVar204 * uStack_d8._4_4_;
        auVar164._16_4_ = fVar205 * (float)uStack_d0;
        auVar164._20_4_ = fVar206 * uStack_d0._4_4_;
        auVar164._24_4_ = fVar207 * (float)uStack_c8;
        auVar164._28_4_ = 0;
        auVar146 = vfmadd231ps_fma(auVar164,auVar159,local_c0);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar149,local_a0);
        auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_80,auVar138);
        auVar38._4_4_ = fVar209 * local_e0._4_4_;
        auVar38._0_4_ = fVar208 * (float)local_e0;
        auVar38._8_4_ = fVar64 * (float)uStack_d8;
        auVar38._12_4_ = fVar65 * uStack_d8._4_4_;
        auVar38._16_4_ = fVar66 * (float)uStack_d0;
        auVar38._20_4_ = fVar67 * uStack_d0._4_4_;
        auVar38._24_4_ = fVar68 * (float)uStack_c8;
        auVar38._28_4_ = uStack_c8._4_4_;
        auVar16 = vfmadd231ps_fma(auVar38,auVar13,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar112,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar94,local_80);
        auVar39._4_4_ = fVar118 * fVar118;
        auVar39._0_4_ = fVar119 * fVar119;
        auVar39._8_4_ = fVar96 * fVar96;
        auVar39._12_4_ = fVar97 * fVar97;
        auVar39._16_4_ = fVar98 * fVar98;
        auVar39._20_4_ = fVar99 * fVar99;
        auVar39._24_4_ = fVar100 * fVar100;
        auVar39._28_4_ = local_80._28_4_;
        auVar17 = vfmadd231ps_fma(auVar39,auVar18,auVar18);
        auVar131 = ZEXT3264(local_6e0);
        auVar114 = ZEXT1632(auVar16);
        auVar88 = vmaxps_avx(ZEXT1632(auVar146),auVar114);
        auVar181._0_4_ = auVar88._0_4_ * auVar88._0_4_ * auVar17._0_4_;
        auVar181._4_4_ = auVar88._4_4_ * auVar88._4_4_ * auVar17._4_4_;
        auVar181._8_4_ = auVar88._8_4_ * auVar88._8_4_ * auVar17._8_4_;
        auVar181._12_4_ = auVar88._12_4_ * auVar88._12_4_ * auVar17._12_4_;
        auVar181._16_4_ = auVar88._16_4_ * auVar88._16_4_ * 0.0;
        auVar181._20_4_ = auVar88._20_4_ * auVar88._20_4_ * 0.0;
        auVar181._24_4_ = auVar88._24_4_ * auVar88._24_4_ * 0.0;
        auVar181._28_4_ = 0;
        auVar40._4_4_ = auVar95._4_4_ * auVar95._4_4_;
        auVar40._0_4_ = auVar95._0_4_ * auVar95._0_4_;
        auVar40._8_4_ = auVar95._8_4_ * auVar95._8_4_;
        auVar40._12_4_ = auVar95._12_4_ * auVar95._12_4_;
        auVar40._16_4_ = auVar95._16_4_ * auVar95._16_4_;
        auVar40._20_4_ = auVar95._20_4_ * auVar95._20_4_;
        auVar40._24_4_ = auVar95._24_4_ * auVar95._24_4_;
        auVar40._28_4_ = auVar95._28_4_;
        auVar88 = vcmpps_avx(auVar40,auVar181,2);
        local_1c0 = (int)lVar80;
        auVar182._4_4_ = local_1c0;
        auVar182._0_4_ = local_1c0;
        auVar182._8_4_ = local_1c0;
        auVar182._12_4_ = local_1c0;
        auVar182._16_4_ = local_1c0;
        auVar182._20_4_ = local_1c0;
        auVar182._24_4_ = local_1c0;
        auVar182._28_4_ = local_1c0;
        auVar95 = vpor_avx2(auVar182,_DAT_01fb4ba0);
        auVar20 = vpcmpgtd_avx2(local_2c0,auVar95);
        auVar95 = auVar20 & auVar88;
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) {
          auVar184 = ZEXT3264(auVar180);
          auVar116 = ZEXT3264(local_680);
          auVar203 = ZEXT3264(local_6e0);
          auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                        CONCAT424(fStack_648,
                                                  CONCAT420(fStack_64c,
                                                            CONCAT416(fStack_650,
                                                                      CONCAT412(fStack_654,
                                                                                CONCAT48(fStack_658,
                                                                                         CONCAT44(
                                                  fStack_65c,local_660))))))));
          auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(
                                                  fVar132,CONCAT412(fVar140,CONCAT48(fVar132,uVar82)
                                                                   ))))));
          auVar197 = ZEXT3264(local_700);
        }
        else {
          local_2e0 = vandps_avx(auVar20,auVar88);
          auVar41._4_4_ = fVar209 * (float)local_520._4_4_;
          auVar41._0_4_ = fVar208 * (float)local_520._0_4_;
          auVar41._8_4_ = fVar64 * fStack_518;
          auVar41._12_4_ = fVar65 * fStack_514;
          auVar41._16_4_ = fVar66 * fStack_510;
          auVar41._20_4_ = fVar67 * fStack_50c;
          auVar41._24_4_ = fVar68 * fStack_508;
          auVar41._28_4_ = auVar88._28_4_;
          auVar16 = vfmadd213ps_fma(auVar13,local_460,auVar41);
          auVar16 = vfmadd213ps_fma(auVar112,local_240,ZEXT1632(auVar16));
          auVar16 = vfmadd132ps_fma(auVar94,ZEXT1632(auVar16),local_5a0);
          local_580._0_4_ = auVar71._0_4_;
          local_580._4_4_ = auVar71._4_4_;
          uStack_578._0_4_ = auVar71._8_4_;
          uStack_578._4_4_ = auVar71._12_4_;
          fStack_570 = auVar71._16_4_;
          fStack_56c = auVar71._20_4_;
          fStack_568 = auVar71._24_4_;
          auVar135._0_4_ = (float)local_520._0_4_ * (float)local_580._0_4_;
          auVar135._4_4_ = (float)local_520._4_4_ * (float)local_580._4_4_;
          auVar135._8_4_ = fStack_518 * (float)uStack_578;
          auVar135._12_4_ = fStack_514 * uStack_578._4_4_;
          auVar135._16_4_ = fStack_510 * fStack_570;
          auVar135._20_4_ = fStack_50c * fStack_56c;
          auVar135._24_4_ = fStack_508 * fStack_568;
          auVar135._28_4_ = 0;
          auVar17 = vfmadd213ps_fma(auVar159,local_460,auVar135);
          auVar17 = vfmadd213ps_fma(auVar149,local_240,ZEXT1632(auVar17));
          auVar149 = *(undefined1 (*) [32])(lVar81 + 0x2200d38 + lVar80 * 4);
          auVar159 = *(undefined1 (*) [32])(lVar81 + 0x22011bc + lVar80 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar81 + 0x2201640 + lVar80 * 4);
          pfVar4 = (float *)(lVar81 + 0x2201ac4 + lVar80 * 4);
          fVar119 = *pfVar4;
          fVar118 = pfVar4[1];
          fVar96 = pfVar4[2];
          fVar97 = pfVar4[3];
          fVar98 = pfVar4[4];
          fVar99 = pfVar4[5];
          fVar100 = pfVar4[6];
          auVar42._4_4_ = fStack_65c * fVar118;
          auVar42._0_4_ = local_660 * fVar119;
          auVar42._8_4_ = fStack_658 * fVar96;
          auVar42._12_4_ = fStack_654 * fVar97;
          auVar42._16_4_ = fStack_650 * fVar98;
          auVar42._20_4_ = fStack_64c * fVar99;
          auVar42._24_4_ = fStack_648 * fVar100;
          auVar42._28_4_ = pfVar3[7];
          auVar192._0_4_ = fVar119 * fVar132;
          auVar192._4_4_ = fVar118 * fVar140;
          auVar192._8_4_ = fVar96 * fVar132;
          auVar192._12_4_ = fVar97 * fVar140;
          auVar192._16_4_ = fVar98 * fVar132;
          auVar192._20_4_ = fVar99 * fVar140;
          auVar192._24_4_ = fVar100 * fVar132;
          auVar192._28_4_ = 0;
          auVar43._4_4_ = fVar118 * (float)local_520._4_4_;
          auVar43._0_4_ = fVar119 * (float)local_520._0_4_;
          auVar43._8_4_ = fVar96 * fStack_518;
          auVar43._12_4_ = fVar97 * fStack_514;
          auVar43._16_4_ = fVar98 * fStack_510;
          auVar43._20_4_ = fVar99 * fStack_50c;
          auVar43._24_4_ = fVar100 * fStack_508;
          auVar43._28_4_ = pfVar4[7];
          auVar86 = vfmadd231ps_fma(auVar42,auVar94,local_6e0);
          auVar85 = vfmadd231ps_fma(auVar192,auVar94,local_620);
          auVar120 = vfmadd231ps_fma(auVar43,local_460,auVar94);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar159,local_700);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar159,local_680);
          auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_240,auVar159);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar149,auVar200);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar149,local_4a0);
          auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar149,local_5a0);
          pfVar3 = (float *)(lVar81 + 0x2203ee4 + lVar80 * 4);
          fVar119 = *pfVar3;
          fVar118 = pfVar3[1];
          fVar96 = pfVar3[2];
          fVar97 = pfVar3[3];
          fVar98 = pfVar3[4];
          fVar99 = pfVar3[5];
          fVar100 = pfVar3[6];
          auVar44._4_4_ = fStack_65c * fVar118;
          auVar44._0_4_ = local_660 * fVar119;
          auVar44._8_4_ = fStack_658 * fVar96;
          auVar44._12_4_ = fStack_654 * fVar97;
          auVar44._16_4_ = fStack_650 * fVar98;
          auVar44._20_4_ = fStack_64c * fVar99;
          auVar44._24_4_ = fStack_648 * fVar100;
          auVar44._28_4_ = fStack_644;
          auVar45._4_4_ = fVar140 * fVar118;
          auVar45._0_4_ = fVar132 * fVar119;
          auVar45._8_4_ = fVar132 * fVar96;
          auVar45._12_4_ = fVar140 * fVar97;
          auVar45._16_4_ = fVar132 * fVar98;
          auVar45._20_4_ = fVar140 * fVar99;
          auVar45._24_4_ = fVar132 * fVar100;
          auVar45._28_4_ = local_300._28_4_;
          auVar46._4_4_ = (float)local_520._4_4_ * fVar118;
          auVar46._0_4_ = (float)local_520._0_4_ * fVar119;
          auVar46._8_4_ = fStack_518 * fVar96;
          auVar46._12_4_ = fStack_514 * fVar97;
          auVar46._16_4_ = fStack_510 * fVar98;
          auVar46._20_4_ = fStack_50c * fVar99;
          auVar46._24_4_ = fStack_508 * fVar100;
          auVar46._28_4_ = pfVar3[7];
          auVar149 = *(undefined1 (*) [32])(lVar81 + 0x2203a60 + lVar80 * 4);
          auVar104 = vfmadd231ps_fma(auVar44,auVar149,local_6e0);
          auVar84 = vfmadd231ps_fma(auVar45,auVar149,local_620);
          auVar105 = vfmadd231ps_fma(auVar46,local_460,auVar149);
          auVar149 = *(undefined1 (*) [32])(lVar81 + 0x22035dc + lVar80 * 4);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar149,local_700);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar149,local_680);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar149,local_240);
          auVar149 = *(undefined1 (*) [32])(lVar81 + 0x2203158 + lVar80 * 4);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar149,auVar200);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar149,local_4a0);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_5a0,auVar149);
          auVar183._8_4_ = 0x7fffffff;
          auVar183._0_8_ = 0x7fffffff7fffffff;
          auVar183._12_4_ = 0x7fffffff;
          auVar183._16_4_ = 0x7fffffff;
          auVar183._20_4_ = 0x7fffffff;
          auVar183._24_4_ = 0x7fffffff;
          auVar183._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(ZEXT1632(auVar86),auVar183);
          auVar159 = vandps_avx(ZEXT1632(auVar85),auVar183);
          auVar159 = vmaxps_avx(auVar149,auVar159);
          auVar149 = vandps_avx(ZEXT1632(auVar120),auVar183);
          auVar149 = vmaxps_avx(auVar159,auVar149);
          auVar149 = vcmpps_avx(auVar149,_local_320,1);
          auVar94 = vblendvps_avx(ZEXT1632(auVar86),auVar18,auVar149);
          auVar112 = vblendvps_avx(ZEXT1632(auVar85),local_300,auVar149);
          auVar149 = vandps_avx(ZEXT1632(auVar104),auVar183);
          auVar159 = vandps_avx(ZEXT1632(auVar84),auVar183);
          auVar159 = vmaxps_avx(auVar149,auVar159);
          auVar149 = vandps_avx(auVar183,ZEXT1632(auVar105));
          auVar149 = vmaxps_avx(auVar159,auVar149);
          auVar159 = vcmpps_avx(auVar149,_local_320,1);
          auVar149 = vblendvps_avx(ZEXT1632(auVar104),auVar18,auVar159);
          auVar159 = vblendvps_avx(ZEXT1632(auVar84),local_300,auVar159);
          auVar17 = vfmadd213ps_fma(auVar138,local_5a0,ZEXT1632(auVar17));
          auVar86 = vfmadd213ps_fma(auVar94,auVar94,ZEXT832(0) << 0x20);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar112,auVar112);
          auVar138 = vrsqrtps_avx(ZEXT1632(auVar86));
          fVar119 = auVar138._0_4_;
          fVar118 = auVar138._4_4_;
          fVar96 = auVar138._8_4_;
          fVar97 = auVar138._12_4_;
          fVar98 = auVar138._16_4_;
          fVar99 = auVar138._20_4_;
          fVar100 = auVar138._24_4_;
          auVar47._4_4_ = fVar118 * fVar118 * fVar118 * auVar86._4_4_ * -0.5;
          auVar47._0_4_ = fVar119 * fVar119 * fVar119 * auVar86._0_4_ * -0.5;
          auVar47._8_4_ = fVar96 * fVar96 * fVar96 * auVar86._8_4_ * -0.5;
          auVar47._12_4_ = fVar97 * fVar97 * fVar97 * auVar86._12_4_ * -0.5;
          auVar47._16_4_ = fVar98 * fVar98 * fVar98 * -0.0;
          auVar47._20_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar47._24_4_ = fVar100 * fVar100 * fVar100 * -0.0;
          auVar47._28_4_ = 0;
          auVar202._8_4_ = 0x3fc00000;
          auVar202._0_8_ = 0x3fc000003fc00000;
          auVar202._12_4_ = 0x3fc00000;
          auVar202._16_4_ = 0x3fc00000;
          auVar202._20_4_ = 0x3fc00000;
          auVar202._24_4_ = 0x3fc00000;
          auVar202._28_4_ = 0x3fc00000;
          auVar86 = vfmadd231ps_fma(auVar47,auVar202,auVar138);
          fVar119 = auVar86._0_4_;
          fVar118 = auVar86._4_4_;
          auVar48._4_4_ = auVar112._4_4_ * fVar118;
          auVar48._0_4_ = auVar112._0_4_ * fVar119;
          fVar96 = auVar86._8_4_;
          auVar48._8_4_ = auVar112._8_4_ * fVar96;
          fVar97 = auVar86._12_4_;
          auVar48._12_4_ = auVar112._12_4_ * fVar97;
          auVar48._16_4_ = auVar112._16_4_ * 0.0;
          auVar48._20_4_ = auVar112._20_4_ * 0.0;
          auVar48._24_4_ = auVar112._24_4_ * 0.0;
          auVar48._28_4_ = auVar138._28_4_;
          auVar49._4_4_ = fVar118 * -auVar94._4_4_;
          auVar49._0_4_ = fVar119 * -auVar94._0_4_;
          auVar49._8_4_ = fVar96 * -auVar94._8_4_;
          auVar49._12_4_ = fVar97 * -auVar94._12_4_;
          auVar49._16_4_ = -auVar94._16_4_ * 0.0;
          auVar49._20_4_ = -auVar94._20_4_ * 0.0;
          auVar49._24_4_ = -auVar94._24_4_ * 0.0;
          auVar49._28_4_ = auVar112._28_4_;
          auVar86 = vfmadd213ps_fma(auVar149,auVar149,ZEXT832(0) << 0x20);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar159,auVar159);
          auVar138 = vrsqrtps_avx(ZEXT1632(auVar86));
          auVar50._28_4_ = uStack_504;
          auVar50._0_28_ =
               ZEXT1628(CONCAT412(fVar97 * 0.0,
                                  CONCAT48(fVar96 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
          fVar119 = auVar138._0_4_;
          fVar118 = auVar138._4_4_;
          fVar96 = auVar138._8_4_;
          fVar97 = auVar138._12_4_;
          fVar98 = auVar138._16_4_;
          fVar99 = auVar138._20_4_;
          fVar100 = auVar138._24_4_;
          auVar51._4_4_ = fVar118 * fVar118 * fVar118 * auVar86._4_4_ * -0.5;
          auVar51._0_4_ = fVar119 * fVar119 * fVar119 * auVar86._0_4_ * -0.5;
          auVar51._8_4_ = fVar96 * fVar96 * fVar96 * auVar86._8_4_ * -0.5;
          auVar51._12_4_ = fVar97 * fVar97 * fVar97 * auVar86._12_4_ * -0.5;
          auVar51._16_4_ = fVar98 * fVar98 * fVar98 * -0.0;
          auVar51._20_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar51._24_4_ = fVar100 * fVar100 * fVar100 * -0.0;
          auVar51._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar51,auVar202,auVar138);
          fVar119 = auVar86._0_4_;
          fVar118 = auVar86._4_4_;
          auVar52._4_4_ = auVar159._4_4_ * fVar118;
          auVar52._0_4_ = auVar159._0_4_ * fVar119;
          fVar96 = auVar86._8_4_;
          auVar52._8_4_ = auVar159._8_4_ * fVar96;
          fVar97 = auVar86._12_4_;
          auVar52._12_4_ = auVar159._12_4_ * fVar97;
          auVar52._16_4_ = auVar159._16_4_ * 0.0;
          auVar52._20_4_ = auVar159._20_4_ * 0.0;
          auVar52._24_4_ = auVar159._24_4_ * 0.0;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = fVar118 * -auVar149._4_4_;
          auVar53._0_4_ = fVar119 * -auVar149._0_4_;
          auVar53._8_4_ = fVar96 * -auVar149._8_4_;
          auVar53._12_4_ = fVar97 * -auVar149._12_4_;
          auVar53._16_4_ = -auVar149._16_4_ * 0.0;
          auVar53._20_4_ = -auVar149._20_4_ * 0.0;
          auVar53._24_4_ = -auVar149._24_4_ * 0.0;
          auVar53._28_4_ = auVar138._28_4_;
          auVar54._28_4_ = 0xbf000000;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar97 * 0.0,
                                  CONCAT48(fVar96 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
          auVar86 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar146),local_480);
          auVar138 = ZEXT1632(auVar146);
          auVar85 = vfmadd213ps_fma(auVar49,auVar138,auVar129);
          auVar120 = vfmadd213ps_fma(auVar50,auVar138,ZEXT1632(auVar17));
          auVar105 = vfnmadd213ps_fma(auVar48,auVar138,local_480);
          auVar104 = vfmadd213ps_fma(auVar52,auVar114,ZEXT1632(auVar14));
          auVar133 = vfnmadd213ps_fma(auVar49,auVar138,auVar129);
          auVar84 = vfmadd213ps_fma(auVar53,auVar114,local_560);
          auVar165 = ZEXT1632(auVar146);
          auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar165,auVar50);
          auVar17 = vfmadd213ps_fma(auVar54,auVar114,ZEXT1632(auVar16));
          auVar142 = vfnmadd213ps_fma(auVar52,auVar114,ZEXT1632(auVar14));
          auVar83 = vfnmadd213ps_fma(auVar53,auVar114,local_560);
          auVar103 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar114,auVar54);
          auVar138 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar133));
          auVar149 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar146));
          auVar166._0_4_ = auVar138._0_4_ * auVar146._0_4_;
          auVar166._4_4_ = auVar138._4_4_ * auVar146._4_4_;
          auVar166._8_4_ = auVar138._8_4_ * auVar146._8_4_;
          auVar166._12_4_ = auVar138._12_4_ * auVar146._12_4_;
          auVar166._16_4_ = auVar138._16_4_ * 0.0;
          auVar166._20_4_ = auVar138._20_4_ * 0.0;
          auVar166._24_4_ = auVar138._24_4_ * 0.0;
          auVar166._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar166,ZEXT1632(auVar133),auVar149);
          auVar55._4_4_ = auVar105._4_4_ * auVar149._4_4_;
          auVar55._0_4_ = auVar105._0_4_ * auVar149._0_4_;
          auVar55._8_4_ = auVar105._8_4_ * auVar149._8_4_;
          auVar55._12_4_ = auVar105._12_4_ * auVar149._12_4_;
          auVar55._16_4_ = auVar149._16_4_ * 0.0;
          auVar55._20_4_ = auVar149._20_4_ * 0.0;
          auVar55._24_4_ = auVar149._24_4_ * 0.0;
          auVar55._28_4_ = auVar149._28_4_;
          auVar88 = ZEXT1632(auVar105);
          auVar149 = vsubps_avx(ZEXT1632(auVar104),auVar88);
          auVar95 = ZEXT1632(auVar146);
          auVar146 = vfmsub231ps_fma(auVar55,auVar95,auVar149);
          auVar56._4_4_ = auVar133._4_4_ * auVar149._4_4_;
          auVar56._0_4_ = auVar133._0_4_ * auVar149._0_4_;
          auVar56._8_4_ = auVar133._8_4_ * auVar149._8_4_;
          auVar56._12_4_ = auVar133._12_4_ * auVar149._12_4_;
          auVar56._16_4_ = auVar149._16_4_ * 0.0;
          auVar56._20_4_ = auVar149._20_4_ * 0.0;
          auVar56._24_4_ = auVar149._24_4_ * 0.0;
          auVar56._28_4_ = auVar149._28_4_;
          auVar16 = vfmsub231ps_fma(auVar56,auVar88,auVar138);
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar146));
          auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar20 = vcmpps_avx(ZEXT1632(auVar146),ZEXT832(0) << 0x20,2);
          auVar138 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar86),auVar20);
          auVar149 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85),auVar20);
          auVar159 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar120),auVar20);
          auVar94 = vblendvps_avx(auVar88,ZEXT1632(auVar104),auVar20);
          auVar112 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar84),auVar20);
          auVar13 = vblendvps_avx(auVar95,ZEXT1632(auVar17),auVar20);
          auVar88 = vblendvps_avx(ZEXT1632(auVar104),auVar88,auVar20);
          auVar18 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar133),auVar20);
          auVar146 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
          auVar95 = vblendvps_avx(ZEXT1632(auVar17),auVar95,auVar20);
          auVar88 = vsubps_avx(auVar88,auVar138);
          auVar18 = vsubps_avx(auVar18,auVar149);
          auVar129 = vsubps_avx(auVar95,auVar159);
          auVar194 = ZEXT3264(auVar129);
          auVar89 = vsubps_avx(auVar138,auVar94);
          auVar108 = vsubps_avx(auVar149,auVar112);
          auVar134 = vsubps_avx(auVar159,auVar13);
          auVar156._0_4_ = auVar129._0_4_ * auVar138._0_4_;
          auVar156._4_4_ = auVar129._4_4_ * auVar138._4_4_;
          auVar156._8_4_ = auVar129._8_4_ * auVar138._8_4_;
          auVar156._12_4_ = auVar129._12_4_ * auVar138._12_4_;
          auVar156._16_4_ = auVar129._16_4_ * auVar138._16_4_;
          auVar156._20_4_ = auVar129._20_4_ * auVar138._20_4_;
          auVar156._24_4_ = auVar129._24_4_ * auVar138._24_4_;
          auVar156._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar156,auVar159,auVar88);
          auVar57._4_4_ = auVar88._4_4_ * auVar149._4_4_;
          auVar57._0_4_ = auVar88._0_4_ * auVar149._0_4_;
          auVar57._8_4_ = auVar88._8_4_ * auVar149._8_4_;
          auVar57._12_4_ = auVar88._12_4_ * auVar149._12_4_;
          auVar57._16_4_ = auVar88._16_4_ * auVar149._16_4_;
          auVar57._20_4_ = auVar88._20_4_ * auVar149._20_4_;
          auVar57._24_4_ = auVar88._24_4_ * auVar149._24_4_;
          auVar57._28_4_ = auVar95._28_4_;
          auVar16 = vfmsub231ps_fma(auVar57,auVar138,auVar18);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar14),_DAT_01f7b000);
          auVar157._0_4_ = auVar18._0_4_ * auVar159._0_4_;
          auVar157._4_4_ = auVar18._4_4_ * auVar159._4_4_;
          auVar157._8_4_ = auVar18._8_4_ * auVar159._8_4_;
          auVar157._12_4_ = auVar18._12_4_ * auVar159._12_4_;
          auVar157._16_4_ = auVar18._16_4_ * auVar159._16_4_;
          auVar157._20_4_ = auVar18._20_4_ * auVar159._20_4_;
          auVar157._24_4_ = auVar18._24_4_ * auVar159._24_4_;
          auVar157._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar157,auVar149,auVar129);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar131 = ZEXT1664(auVar16);
          auVar158._0_4_ = auVar134._0_4_ * auVar94._0_4_;
          auVar158._4_4_ = auVar134._4_4_ * auVar94._4_4_;
          auVar158._8_4_ = auVar134._8_4_ * auVar94._8_4_;
          auVar158._12_4_ = auVar134._12_4_ * auVar94._12_4_;
          auVar158._16_4_ = auVar134._16_4_ * auVar94._16_4_;
          auVar158._20_4_ = auVar134._20_4_ * auVar94._20_4_;
          auVar158._24_4_ = auVar134._24_4_ * auVar94._24_4_;
          auVar158._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar158,auVar89,auVar13);
          auVar58._4_4_ = auVar108._4_4_ * auVar13._4_4_;
          auVar58._0_4_ = auVar108._0_4_ * auVar13._0_4_;
          auVar58._8_4_ = auVar108._8_4_ * auVar13._8_4_;
          auVar58._12_4_ = auVar108._12_4_ * auVar13._12_4_;
          auVar58._16_4_ = auVar108._16_4_ * auVar13._16_4_;
          auVar58._20_4_ = auVar108._20_4_ * auVar13._20_4_;
          auVar58._24_4_ = auVar108._24_4_ * auVar13._24_4_;
          auVar58._28_4_ = auVar13._28_4_;
          auVar17 = vfmsub231ps_fma(auVar58,auVar112,auVar134);
          auVar59._4_4_ = auVar89._4_4_ * auVar112._4_4_;
          auVar59._0_4_ = auVar89._0_4_ * auVar112._0_4_;
          auVar59._8_4_ = auVar89._8_4_ * auVar112._8_4_;
          auVar59._12_4_ = auVar89._12_4_ * auVar112._12_4_;
          auVar59._16_4_ = auVar89._16_4_ * auVar112._16_4_;
          auVar59._20_4_ = auVar89._20_4_ * auVar112._20_4_;
          auVar59._24_4_ = auVar89._24_4_ * auVar112._24_4_;
          auVar59._28_4_ = auVar112._28_4_;
          auVar86 = vfmsub231ps_fma(auVar59,auVar108,auVar94);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar94 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
          auVar94 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,2);
          auVar14 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
          auVar146 = vpand_avx(auVar14,auVar146);
          auVar94 = vpmovsxwd_avx2(auVar146);
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0xbf,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar94[0x1f]) {
LAB_01128aee:
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar184 = ZEXT3264(auVar180);
            auVar174 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
          }
          else {
            auVar60._4_4_ = auVar18._4_4_ * auVar134._4_4_;
            auVar60._0_4_ = auVar18._0_4_ * auVar134._0_4_;
            auVar60._8_4_ = auVar18._8_4_ * auVar134._8_4_;
            auVar60._12_4_ = auVar18._12_4_ * auVar134._12_4_;
            auVar60._16_4_ = auVar18._16_4_ * auVar134._16_4_;
            auVar60._20_4_ = auVar18._20_4_ * auVar134._20_4_;
            auVar60._24_4_ = auVar18._24_4_ * auVar134._24_4_;
            auVar60._28_4_ = auVar94._28_4_;
            auVar120 = vfmsub231ps_fma(auVar60,auVar108,auVar129);
            auVar167._0_4_ = auVar129._0_4_ * auVar89._0_4_;
            auVar167._4_4_ = auVar129._4_4_ * auVar89._4_4_;
            auVar167._8_4_ = auVar129._8_4_ * auVar89._8_4_;
            auVar167._12_4_ = auVar129._12_4_ * auVar89._12_4_;
            auVar167._16_4_ = auVar129._16_4_ * auVar89._16_4_;
            auVar167._20_4_ = auVar129._20_4_ * auVar89._20_4_;
            auVar167._24_4_ = auVar129._24_4_ * auVar89._24_4_;
            auVar167._28_4_ = 0;
            auVar85 = vfmsub231ps_fma(auVar167,auVar88,auVar134);
            auVar61._4_4_ = auVar88._4_4_ * auVar108._4_4_;
            auVar61._0_4_ = auVar88._0_4_ * auVar108._0_4_;
            auVar61._8_4_ = auVar88._8_4_ * auVar108._8_4_;
            auVar61._12_4_ = auVar88._12_4_ * auVar108._12_4_;
            auVar61._16_4_ = auVar88._16_4_ * auVar108._16_4_;
            auVar61._20_4_ = auVar88._20_4_ * auVar108._20_4_;
            auVar61._24_4_ = auVar88._24_4_ * auVar108._24_4_;
            auVar61._28_4_ = auVar108._28_4_;
            auVar104 = vfmsub231ps_fma(auVar61,auVar89,auVar18);
            auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar104));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar120),ZEXT832(0) << 0x20);
            auVar94 = vrcpps_avx(ZEXT1632(auVar86));
            auVar193._8_4_ = 0x3f800000;
            auVar193._0_8_ = 0x3f8000003f800000;
            auVar193._12_4_ = 0x3f800000;
            auVar193._16_4_ = 0x3f800000;
            auVar193._20_4_ = 0x3f800000;
            auVar193._24_4_ = 0x3f800000;
            auVar193._28_4_ = 0x3f800000;
            auVar194 = ZEXT3264(auVar193);
            auVar14 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar86),auVar193);
            auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar94,auVar94);
            auVar136._0_4_ = auVar104._0_4_ * auVar159._0_4_;
            auVar136._4_4_ = auVar104._4_4_ * auVar159._4_4_;
            auVar136._8_4_ = auVar104._8_4_ * auVar159._8_4_;
            auVar136._12_4_ = auVar104._12_4_ * auVar159._12_4_;
            auVar136._16_4_ = auVar159._16_4_ * 0.0;
            auVar136._20_4_ = auVar159._20_4_ * 0.0;
            auVar136._24_4_ = auVar159._24_4_ * 0.0;
            auVar136._28_4_ = 0;
            auVar85 = vfmadd231ps_fma(auVar136,ZEXT1632(auVar85),auVar149);
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar138,ZEXT1632(auVar120));
            fVar119 = auVar14._0_4_;
            fVar118 = auVar14._4_4_;
            fVar96 = auVar14._8_4_;
            fVar97 = auVar14._12_4_;
            auVar159 = ZEXT1632(CONCAT412(fVar97 * auVar85._12_4_,
                                          CONCAT48(fVar96 * auVar85._8_4_,
                                                   CONCAT44(fVar118 * auVar85._4_4_,
                                                            fVar119 * auVar85._0_4_))));
            uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar137._4_4_ = uVar72;
            auVar137._0_4_ = uVar72;
            auVar137._8_4_ = uVar72;
            auVar137._12_4_ = uVar72;
            auVar137._16_4_ = uVar72;
            auVar137._20_4_ = uVar72;
            auVar137._24_4_ = uVar72;
            auVar137._28_4_ = uVar72;
            auVar138 = vcmpps_avx(local_340,auVar159,2);
            auVar149 = vcmpps_avx(auVar159,auVar137,2);
            auVar138 = vandps_avx(auVar149,auVar138);
            auVar14 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
            auVar146 = vpand_avx(auVar146,auVar14);
            auVar138 = vpmovsxwd_avx2(auVar146);
            if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar138 >> 0x7f,0) == '\0') &&
                  (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar138 >> 0xbf,0) == '\0') &&
                (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar138[0x1f]) goto LAB_01128aee;
            auVar138 = vcmpps_avx(ZEXT1632(auVar86),ZEXT832(0) << 0x20,4);
            auVar14 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
            auVar146 = vpand_avx(auVar146,auVar14);
            auVar138 = vpmovsxwd_avx2(auVar146);
            auVar174 = ZEXT3264(CONCAT824(uStack_4c8,
                                          CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
            auVar190 = ZEXT3264(auVar190._0_32_);
            auVar184 = ZEXT3264(auVar180);
            if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar138 >> 0x7f,0) != '\0') ||
                  (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar138 >> 0xbf,0) != '\0') ||
                (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar138[0x1f] < '\0') {
              auVar94 = ZEXT1632(CONCAT412(fVar97 * auVar16._12_4_,
                                           CONCAT48(fVar96 * auVar16._8_4_,
                                                    CONCAT44(fVar118 * auVar16._4_4_,
                                                             fVar119 * auVar16._0_4_))));
              auVar62._28_4_ = SUB84(uStack_4c8,4);
              auVar62._0_28_ =
                   ZEXT1628(CONCAT412(fVar97 * auVar17._12_4_,
                                      CONCAT48(fVar96 * auVar17._8_4_,
                                               CONCAT44(fVar118 * auVar17._4_4_,
                                                        fVar119 * auVar17._0_4_))));
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar149 = vsubps_avx(auVar176,auVar94);
              auVar149 = vblendvps_avx(auVar149,auVar94,auVar20);
              auVar190 = ZEXT3264(auVar149);
              auVar149 = vsubps_avx(auVar176,auVar62);
              local_3a0 = vblendvps_avx(auVar149,auVar62,auVar20);
              auVar131 = ZEXT3264(local_3a0);
              auVar174 = ZEXT3264(auVar138);
              auVar184 = ZEXT3264(auVar159);
            }
          }
          auVar203 = ZEXT3264(local_6e0);
          auVar197 = ZEXT3264(local_700);
          auVar138 = auVar174._0_32_;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar138 >> 0x7f,0) == '\0') &&
                (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar138 >> 0xbf,0) == '\0') &&
              (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar174[0x1f]) {
            auVar116 = ZEXT3264(local_680);
            auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(
                                                  fVar132,CONCAT412(fVar140,CONCAT48(fVar132,uVar82)
                                                                   ))))));
          }
          else {
            auVar149 = vsubps_avx(auVar114,auVar165);
            local_6c0 = auVar190._0_32_;
            auVar146 = vfmadd213ps_fma(auVar149,local_6c0,auVar165);
            fVar119 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar63._4_4_ = (auVar146._4_4_ + auVar146._4_4_) * fVar119;
            auVar63._0_4_ = (auVar146._0_4_ + auVar146._0_4_) * fVar119;
            auVar63._8_4_ = (auVar146._8_4_ + auVar146._8_4_) * fVar119;
            auVar63._12_4_ = (auVar146._12_4_ + auVar146._12_4_) * fVar119;
            auVar63._16_4_ = fVar119 * 0.0;
            auVar63._20_4_ = fVar119 * 0.0;
            auVar63._24_4_ = fVar119 * 0.0;
            auVar63._28_4_ = fVar119;
            local_720 = auVar184._0_32_;
            auVar149 = vcmpps_avx(local_720,auVar63,6);
            auVar159 = auVar138 & auVar149;
            auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,CONCAT416(
                                                  fVar132,CONCAT412(fVar140,CONCAT48(fVar132,uVar82)
                                                                   ))))));
            if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0x7f,0) == '\0') &&
                  (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0xbf,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar159[0x1f]) {
              auVar116 = ZEXT3264(local_680);
            }
            else {
              auVar115._8_4_ = 0xbf800000;
              auVar115._0_8_ = 0xbf800000bf800000;
              auVar115._12_4_ = 0xbf800000;
              auVar115._16_4_ = 0xbf800000;
              auVar115._20_4_ = 0xbf800000;
              auVar115._24_4_ = 0xbf800000;
              auVar115._28_4_ = 0xbf800000;
              auVar130._8_4_ = 0x40000000;
              auVar130._0_8_ = 0x4000000040000000;
              auVar130._12_4_ = 0x40000000;
              auVar130._16_4_ = 0x40000000;
              auVar130._20_4_ = 0x40000000;
              auVar130._24_4_ = 0x40000000;
              auVar130._28_4_ = 0x40000000;
              auVar131 = ZEXT3264(auVar130);
              auVar146 = vfmadd213ps_fma(local_3a0,auVar130,auVar115);
              local_200 = ZEXT1632(auVar146);
              local_1b0 = local_630;
              uStack_1a8 = uStack_628;
              local_1a0 = local_5f0._0_8_;
              uStack_198 = local_5f0._8_8_;
              local_190 = local_600._0_8_;
              uStack_188 = local_600._8_8_;
              pGVar74 = (context->scene->geometries).items[local_728].ptr;
              local_3a0 = local_200;
              if ((pGVar74->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar75 = (RTCIntersectArguments *)0x0;
                auVar116 = ZEXT3264(local_680);
              }
              else {
                pRVar75 = context->args;
                auVar116 = ZEXT3264(local_680);
                if ((pRVar75->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar75 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar75 >> 8),1),
                   pGVar74->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_560 = ZEXT1632(CONCAT124(auVar15._4_12_,(int)uVar76));
                  auVar138 = vandps_avx(auVar149,auVar138);
                  fVar119 = (float)local_1c0;
                  auVar131 = ZEXT3264(CONCAT428(fVar119,CONCAT424(fVar119,CONCAT420(fVar119,
                                                  CONCAT416(fVar119,CONCAT412(fVar119,CONCAT48(
                                                  fVar119,CONCAT44(fVar119,fVar119))))))));
                  local_140[0] = (fVar119 + auVar190._0_4_ + 0.0) * (float)local_4c0;
                  local_140[1] = (fVar119 + auVar190._4_4_ + 1.0) * local_4c0._4_4_;
                  local_140[2] = (fVar119 + auVar190._8_4_ + 2.0) * fStack_4b8;
                  local_140[3] = (fVar119 + auVar190._12_4_ + 3.0) * fStack_4b4;
                  fStack_130 = (fVar119 + auVar190._16_4_ + 4.0) * fStack_4b0;
                  fStack_12c = (fVar119 + auVar190._20_4_ + 5.0) * fStack_4ac;
                  fStack_128 = (fVar119 + auVar190._24_4_ + 6.0) * fStack_4a8;
                  fStack_124 = fVar119 + auVar190._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar146._0_8_;
                  local_3a0._8_8_ = auVar146._8_8_;
                  local_120 = local_3a0._0_8_;
                  uStack_118 = local_3a0._8_8_;
                  uStack_110 = 0;
                  uStack_108 = 0;
                  local_100 = local_720;
                  uVar72 = vmovmskps_avx(auVar138);
                  uVar76 = 0;
                  uVar78 = CONCAT44((int)((ulong)pRVar75 >> 0x20),uVar72);
                  for (uVar21 = uVar78; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    uVar76 = uVar76 + 1;
                  }
                  local_6a0 = ZEXT1632(CONCAT88(auVar12._8_8_,pGVar74));
                  _local_580 = auVar114;
                  local_220 = local_6c0;
                  local_1e0 = local_720;
                  local_1bc = iVar10;
                  while (uVar78 != 0) {
                    uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar119 = local_140[uVar76];
                    local_400._4_4_ = fVar119;
                    local_400._0_4_ = fVar119;
                    local_400._8_4_ = fVar119;
                    local_400._12_4_ = fVar119;
                    local_3f0 = *(undefined4 *)((long)&local_120 + uVar76 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar76 * 4);
                    fVar96 = 1.0 - fVar119;
                    auVar146 = ZEXT416((uint)(fVar119 * fVar96 * 4.0));
                    auVar12 = vfnmsub213ss_fma(local_400,local_400,auVar146);
                    auVar146 = vfmadd213ss_fma(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),auVar146)
                    ;
                    fVar118 = auVar146._0_4_ * 0.5;
                    fVar119 = fVar119 * fVar119 * 0.5;
                    auVar147._0_4_ = fVar119 * (float)local_500._0_4_;
                    auVar147._4_4_ = fVar119 * (float)local_500._4_4_;
                    auVar147._8_4_ = fVar119 * fStack_4f8;
                    auVar147._12_4_ = fVar119 * fStack_4f4;
                    auVar124._4_4_ = fVar118;
                    auVar124._0_4_ = fVar118;
                    auVar124._8_4_ = fVar118;
                    auVar124._12_4_ = fVar118;
                    auVar146 = vfmadd132ps_fma(auVar124,auVar147,local_600);
                    fVar119 = auVar12._0_4_ * 0.5;
                    auVar148._4_4_ = fVar119;
                    auVar148._0_4_ = fVar119;
                    auVar148._8_4_ = fVar119;
                    auVar148._12_4_ = fVar119;
                    auVar146 = vfmadd132ps_fma(auVar148,auVar146,local_5f0);
                    local_5d0.context = context->user;
                    fVar119 = fVar96 * -fVar96 * 0.5;
                    auVar125._4_4_ = fVar119;
                    auVar125._0_4_ = fVar119;
                    auVar125._8_4_ = fVar119;
                    auVar125._12_4_ = fVar119;
                    auVar70._8_8_ = uStack_628;
                    auVar70._0_8_ = local_630;
                    auVar146 = vfmadd132ps_fma(auVar125,auVar146,auVar70);
                    local_430 = auVar146._0_4_;
                    local_420 = vshufps_avx(auVar146,auVar146,0x55);
                    local_410 = vshufps_avx(auVar146,auVar146,0xaa);
                    auVar131 = ZEXT1664(local_410);
                    local_3e0 = local_360._0_8_;
                    uStack_3d8 = local_360._8_8_;
                    local_3d0 = _local_530;
                    vpcmpeqd_avx2(ZEXT1632(_local_530),ZEXT1632(_local_530));
                    uStack_3bc = (local_5d0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_5d0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_740 = *local_5d8;
                    local_5d0.valid = (int *)local_740;
                    local_5d0.geometryUserPtr = pGVar74->userPtr;
                    local_5d0.hit = (RTCHitN *)&local_430;
                    local_5d0.N = 4;
                    local_5d0.ray = (RTCRayN *)ray;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    if (pGVar74->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar131 = ZEXT1664(local_410);
                      auVar194 = ZEXT1664(auVar194._0_16_);
                      (*pGVar74->occlusionFilterN)(&local_5d0);
                    }
                    if (local_740 == (undefined1  [16])0x0) {
                      auVar146 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar146 = auVar146 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar194 = ZEXT1664(auVar194._0_16_);
                        (*p_Var11)(&local_5d0);
                      }
                      auVar12 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                      auVar146 = auVar12 ^ _DAT_01f46b70;
                      auVar126._8_4_ = 0xff800000;
                      auVar126._0_8_ = 0xff800000ff800000;
                      auVar126._12_4_ = 0xff800000;
                      auVar131 = ZEXT1664(auVar126);
                      auVar12 = vblendvps_avx(auVar126,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                              auVar12);
                      *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar12;
                    }
                    auVar107._8_8_ = 0x100000001;
                    auVar107._0_8_ = 0x100000001;
                    if ((auVar107 & auVar146) != (undefined1  [16])0x0) {
                      pRVar75 = (RTCIntersectArguments *)0x1;
                      goto LAB_01128b14;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar72;
                    uVar21 = uVar76 & 0x3f;
                    uVar76 = 0;
                    uVar78 = uVar78 ^ 1L << uVar21;
                    for (uVar21 = uVar78; pGVar74 = (Geometry *)local_6a0._0_8_, (uVar21 & 1) == 0;
                        uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                      uVar76 = uVar76 + 1;
                    }
                  }
                  pRVar75 = (RTCIntersectArguments *)0x0;
LAB_01128b14:
                  auVar190 = ZEXT3264(local_6c0);
                  auVar184 = ZEXT3264(local_720);
                  auVar116 = ZEXT3264(local_680);
                  auVar203 = ZEXT3264(local_6e0);
                  auVar174 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar168 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar132,CONCAT420(fVar140,
                                                  CONCAT416(fVar132,CONCAT412(fVar140,CONCAT48(
                                                  fVar132,uVar82)))))));
                  auVar197 = ZEXT3264(local_700);
                  uVar76 = (ulong)(uint)local_560._0_4_;
                }
              }
              uVar76 = CONCAT71((int7)(uVar76 >> 8),(byte)uVar76 | (byte)pRVar75);
            }
          }
        }
        auVar139 = ZEXT3264(local_620);
      }
    }
    if ((uVar76 & 1) != 0) break;
    uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87._4_4_ = uVar72;
    auVar87._0_4_ = uVar72;
    auVar87._8_4_ = uVar72;
    auVar87._12_4_ = uVar72;
    auVar146 = vcmpps_avx(local_2a0,auVar87,2);
    uVar77 = vmovmskps_avx(auVar146);
  }
  return local_4e8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }